

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O3

idx_t duckdb::TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  PhysicalType PVar1;
  ulong *puVar2;
  SelectionVector *pSVar3;
  uint *puVar4;
  short *psVar5;
  ushort *puVar6;
  byte *pbVar7;
  unsigned_long *puVar8;
  data_ptr_t pdVar9;
  sel_t *psVar10;
  data_ptr_t pdVar11;
  unsigned_long *puVar12;
  sel_t *psVar13;
  sel_t *psVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  element_type *peVar18;
  undefined1 auVar19 [8];
  undefined8 uVar20;
  SelectionVector *pSVar21;
  _Head_base<0UL,_unsigned_long_*,_false> _Var22;
  Vector *pVVar23;
  element_type *peVar24;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  reference pvVar26;
  type pVVar27;
  UnifiedVectorFormat *pUVar28;
  optional_ptr<duckdb::SelectionVector,_true> oVar29;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar30;
  TemplatedValidityData<unsigned_long> *pTVar31;
  long lVar32;
  NotImplementedException *this_01;
  InternalException *this_02;
  ulong uVar33;
  idx_t iVar34;
  undefined4 uVar35;
  int iVar36;
  idx_t idx_in_entry;
  idx_t iVar37;
  float *pfVar38;
  double *pdVar39;
  string_t *psVar40;
  uhugeint_t *puVar41;
  size_type __n;
  long *plVar42;
  ulong *puVar43;
  sel_t sVar44;
  int *piVar45;
  long lVar46;
  long lVar47;
  idx_t iVar48;
  idx_t iVar49;
  ulong uVar50;
  ulong uVar51;
  long lVar52;
  int iVar53;
  idx_t pos_1;
  idx_t iVar54;
  int *piVar55;
  optional_ptr<duckdb::ValidityMask,_true> null_mask_00;
  idx_t iVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  float *pfVar61;
  double *pdVar62;
  string_t *psVar63;
  uhugeint_t *puVar64;
  bool bVar65;
  interval_t *input_6;
  long lVar66;
  ulong uVar67;
  bool bVar68;
  bool bVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  interval_t *input_1;
  UnifiedVectorFormat lvdata;
  UnifiedVectorFormat rvdata;
  SelectionVector slice_sel;
  SelectionVector lcursor;
  SelectionVector maybe_vec;
  SelectionVector rcursor;
  ValidityMask child_validity;
  SelectionVector false_sel_1;
  SelectionVector true_sel_1;
  Vector lchild;
  Vector rchild;
  UnifiedVectorFormat rvdata_1;
  OptionalSelection false_opt;
  OptionalSelection true_opt;
  UnifiedVectorFormat lvdata_1;
  SelectionVector false_vec;
  SelectionVector true_vec;
  Vector l_not_null;
  Vector r_not_null;
  idx_t local_4d0;
  optional_ptr<duckdb::ValidityMask,_true> local_4c8;
  long local_4c0;
  optional_ptr<duckdb::ValidityMask,_true> local_4a8;
  long local_4a0;
  undefined1 local_498 [8];
  LogicalType LStack_490;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_478;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_438;
  undefined1 local_428 [8];
  LogicalType LStack_420;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c8;
  element_type *local_3c0;
  optional_ptr<duckdb::ValidityMask,_true> local_3b8;
  idx_t local_3b0;
  SelectionVector local_3a8;
  SelectionVector local_390;
  SelectionVector local_378;
  SelectionVector local_360;
  undefined1 local_348 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_318;
  SelectionVector local_310;
  Vector local_2f8;
  undefined1 local_288 [8];
  LogicalType aLStack_280 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  optional_ptr<duckdb::SelectionVector,_true> local_218;
  optional_ptr<duckdb::SelectionVector,_true> local_210;
  optional_ptr<const_duckdb::SelectionVector,_true> local_208;
  UnifiedVectorFormat local_200;
  OptionalSelection local_1b8;
  OptionalSelection local_198;
  UnifiedVectorFormat local_178;
  SelectionVector local_130;
  SelectionVector local_118;
  Vector local_100;
  Vector local_98;
  
  PVar1 = (left->type).physical_type_;
  local_4c8.ptr = (ValidityMask *)sel.ptr;
  if (199 < PVar1) {
    if (PVar1 != VARCHAR) {
      if (PVar1 == UINT128) {
        local_288 = (undefined1  [8])null_mask.ptr;
        if (sel.ptr == (SelectionVector *)0x0) {
          local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
        }
        if (null_mask.ptr != (ValidityMask *)0x0) {
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
          UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
          UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
        }
        if (left->vector_type == FLAT_VECTOR) {
          if (right->vector_type == FLAT_VECTOR) {
            puVar41 = (uhugeint_t *)left->data;
            puVar64 = (uhugeint_t *)right->data;
            FlatVector::VerifyFlatVector(left);
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return 0;
              }
              lVar46 = 0;
              local_4d0 = 0;
              uVar67 = 0;
              do {
                uVar33 = uVar67;
                if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                    (sel_t *)0x0) {
                  uVar33 = (ulong)(*(sel_t **)
                                    &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                  [uVar67];
                }
                puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                }
                puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
                }
                bVar65 = (bool)(bVar68 ^ 1);
                if (!bVar69 && bVar65 == false) {
                  bVar68 = uhugeint_t::operator>(puVar41,puVar64);
                  bVar65 = !bVar68;
                }
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
                local_4d0 = local_4d0 + bVar68;
                (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)bVar65;
                uVar67 = uVar67 + 1;
                puVar41 = puVar41 + 1;
                puVar64 = puVar64 + 1;
              } while (count != uVar67);
              return local_4d0;
            }
            if (true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return 0;
              }
              uVar67 = 0;
              local_4d0 = 0;
              do {
                uVar33 = uVar67;
                if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                    (sel_t *)0x0) {
                  uVar33 = (ulong)(*(sel_t **)
                                    &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                  [uVar67];
                }
                puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                }
                puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
                }
                if (!bVar69 && bVar68 == true) {
                  bVar68 = uhugeint_t::operator>(puVar41,puVar64);
                }
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
                local_4d0 = local_4d0 + bVar68;
                uVar67 = uVar67 + 1;
                puVar41 = puVar41 + 1;
                puVar64 = puVar64 + 1;
              } while (count != uVar67);
              return local_4d0;
            }
            if (count != 0) {
              lVar46 = 0;
              uVar67 = 0;
              do {
                uVar33 = uVar67;
                if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                    (sel_t *)0x0) {
                  uVar33 = (ulong)(*(sel_t **)
                                    &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                  [uVar67];
                }
                puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                }
                puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar68 = false;
                }
                else {
                  bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                }
                if (!bVar69 && bVar68 == false) {
                  bVar68 = uhugeint_t::operator>(puVar41,puVar64);
                  bVar68 = !bVar68;
                }
                (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)bVar68;
                uVar67 = uVar67 + 1;
                puVar41 = puVar41 + 1;
                puVar64 = puVar64 + 1;
              } while (count != uVar67);
              goto LAB_00b4259b;
            }
            goto LAB_00b42598;
          }
          if (right->vector_type == CONSTANT_VECTOR) {
            puVar41 = (uhugeint_t *)right->data;
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar64 = (uhugeint_t *)left->data;
            _local_498 = (undefined1  [16])0x0;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
            if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
              local_2f8._0_8_ = 0x800;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_428,(unsigned_long *)&local_2f8);
              peVar18 = LStack_490.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              auVar19 = local_428;
              LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)LStack_420._0_8_;
              _local_428 = (undefined1  [16])0x0;
              auVar16 = _local_428;
              local_428[0] = auVar19[0];
              local_428[1] = auVar19[1];
              local_428._2_6_ = auVar19._2_6_;
              LStack_490.id_ = local_428[0];
              LStack_490.physical_type_ = local_428[1];
              LStack_490._2_6_ = local_428._2_6_;
              _local_428 = auVar16;
              if (peVar18 != (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
                }
              }
              pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(local_498 + 8));
              local_498 = *(undefined1 (*) [8])
                           &(pTVar31->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                            .super__Head_base<0UL,_unsigned_long_*,_false>;
              *(undefined8 *)local_498 = 0xfffffffffffffffe;
            }
            FlatVector::VerifyFlatVector(left);
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_00b434b0;
                lVar46 = 0;
                uVar67 = 0;
                do {
                  uVar33 = uVar67;
                  if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                      (sel_t *)0x0) {
                    uVar33 = (ulong)(*(sel_t **)
                                      &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                    [uVar67];
                  }
                  puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                  ;
                  if (puVar8 == (unsigned_long *)0x0) {
                    bVar69 = false;
                  }
                  else {
                    bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                  }
                  if (local_498 == (undefined1  [8])0x0) {
                    bVar68 = false;
                  }
                  else {
                    bVar68 = (*(byte *)local_498 & 1) == 0;
                  }
                  if (!bVar69 && bVar68 == false) {
                    bVar68 = uhugeint_t::operator>(puVar64,puVar41);
                    bVar68 = !bVar68;
                  }
                  (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
                  lVar46 = lVar46 + (ulong)bVar68;
                  uVar67 = uVar67 + 1;
                  puVar64 = puVar64 + 1;
                } while (count != uVar67);
                goto LAB_00b434b3;
              }
              if (count != 0) {
                uVar67 = 0;
                local_4d0 = 0;
                do {
                  uVar33 = uVar67;
                  if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                      (sel_t *)0x0) {
                    uVar33 = (ulong)(*(sel_t **)
                                      &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                    [uVar67];
                  }
                  puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                  ;
                  if (puVar8 == (unsigned_long *)0x0) {
                    bVar69 = false;
                  }
                  else {
                    bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                  }
                  if (local_498 == (undefined1  [8])0x0) {
                    bVar68 = true;
                  }
                  else {
                    bVar68 = (bool)(*(byte *)local_498 & 1);
                  }
                  if (!bVar69 && bVar68 == true) {
                    bVar68 = uhugeint_t::operator>(puVar64,puVar41);
                  }
                  (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
                  local_4d0 = local_4d0 + bVar68;
                  uVar67 = uVar67 + 1;
                  puVar64 = puVar64 + 1;
                  local_478._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       LStack_490.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                } while (count != uVar67);
                goto LAB_00b43709;
              }
            }
            else if (count != 0) {
              lVar46 = 0;
              local_4d0 = 0;
              uVar67 = 0;
              do {
                uVar33 = uVar67;
                if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                    (sel_t *)0x0) {
                  uVar33 = (ulong)(*(sel_t **)
                                    &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                  [uVar67];
                }
                puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (bool)(*(byte *)local_498 & 1);
                }
                bVar65 = (bool)(bVar68 ^ 1);
                if (!bVar69 && bVar65 == false) {
                  bVar68 = uhugeint_t::operator>(puVar64,puVar41);
                  bVar65 = !bVar68;
                }
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
                local_4d0 = local_4d0 + bVar68;
                (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)bVar65;
                uVar67 = uVar67 + 1;
                puVar64 = puVar64 + 1;
                local_478._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     LStack_490.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              } while (count != uVar67);
              goto LAB_00b43709;
            }
            goto LAB_00b3fc75;
          }
        }
        else if (left->vector_type == CONSTANT_VECTOR) {
          if (right->vector_type == FLAT_VECTOR) {
            puVar41 = (uhugeint_t *)left->data;
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar64 = (uhugeint_t *)right->data;
            _local_498 = (undefined1  [16])0x0;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
            if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
              local_2f8._0_8_ = 0x800;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_428,(unsigned_long *)&local_2f8);
              peVar18 = LStack_490.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              auVar19 = local_428;
              LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)LStack_420._0_8_;
              _local_428 = (undefined1  [16])0x0;
              auVar16 = _local_428;
              local_428[0] = auVar19[0];
              local_428[1] = auVar19[1];
              local_428._2_6_ = auVar19._2_6_;
              LStack_490.id_ = local_428[0];
              LStack_490.physical_type_ = local_428[1];
              LStack_490._2_6_ = local_428._2_6_;
              _local_428 = auVar16;
              if (peVar18 != (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
                }
              }
              pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(local_498 + 8));
              local_498 = *(undefined1 (*) [8])
                           &(pTVar31->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                            .super__Head_base<0UL,_unsigned_long_*,_false>;
              *(undefined8 *)local_498 = 0xfffffffffffffffe;
            }
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_00b43544;
                lVar46 = 0;
                uVar67 = 0;
                do {
                  uVar33 = uVar67;
                  if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                      (sel_t *)0x0) {
                    uVar33 = (ulong)(*(sel_t **)
                                      &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                    [uVar67];
                  }
                  if (local_498 == (undefined1  [8])0x0) {
                    bVar69 = false;
                  }
                  else {
                    bVar69 = (*(byte *)local_498 & 1) == 0;
                  }
                  puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_mask;
                  if (puVar8 == (unsigned_long *)0x0) {
                    bVar68 = false;
                  }
                  else {
                    bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                  }
                  if (!bVar69 && bVar68 == false) {
                    bVar68 = uhugeint_t::operator>(puVar41,puVar64);
                    bVar68 = !bVar68;
                  }
                  (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
                  lVar46 = lVar46 + (ulong)bVar68;
                  uVar67 = uVar67 + 1;
                  puVar64 = puVar64 + 1;
                } while (count != uVar67);
                goto LAB_00b43547;
              }
              if (count != 0) {
                uVar67 = 0;
                local_4d0 = 0;
                do {
                  uVar33 = uVar67;
                  if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                      (sel_t *)0x0) {
                    uVar33 = (ulong)(*(sel_t **)
                                      &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                    [uVar67];
                  }
                  if (local_498 == (undefined1  [8])0x0) {
                    bVar69 = false;
                  }
                  else {
                    bVar69 = (*(byte *)local_498 & 1) == 0;
                  }
                  puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_mask;
                  if (puVar8 == (unsigned_long *)0x0) {
                    bVar68 = true;
                  }
                  else {
                    bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
                  }
                  if (!bVar69 && bVar68 == true) {
                    bVar68 = uhugeint_t::operator>(puVar41,puVar64);
                  }
                  (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
                  local_4d0 = local_4d0 + bVar68;
                  uVar67 = uVar67 + 1;
                  puVar64 = puVar64 + 1;
                  local_478._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       LStack_490.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                } while (count != uVar67);
                goto LAB_00b43709;
              }
            }
            else if (count != 0) {
              lVar46 = 0;
              local_4d0 = 0;
              uVar67 = 0;
              do {
                uVar33 = uVar67;
                if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                    (sel_t *)0x0) {
                  uVar33 = (ulong)(*(sel_t **)
                                    &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                  [uVar67];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (*(byte *)local_498 & 1) == 0;
                }
                puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
                }
                bVar65 = (bool)(bVar68 ^ 1);
                if (!bVar69 && bVar65 == false) {
                  bVar68 = uhugeint_t::operator>(puVar41,puVar64);
                  bVar65 = !bVar68;
                }
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
                local_4d0 = local_4d0 + bVar68;
                (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)bVar65;
                uVar67 = uVar67 + 1;
                puVar64 = puVar64 + 1;
                local_478._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     LStack_490.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              } while (count != uVar67);
              goto LAB_00b43709;
            }
            goto LAB_00b3fc75;
          }
          if (right->vector_type == CONSTANT_VECTOR) {
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (ulong *)0x0) {
              if (puVar43 != (ulong *)0x0) {
                bVar69 = false;
                goto LAB_00b41a6a;
              }
            }
            else {
              uVar67 = *puVar2;
              bVar69 = (uVar67 & 1) == 0;
              if (puVar43 == (ulong *)0x0) {
                if ((uVar67 & 1) == 0) goto LAB_00b41a7a;
              }
              else {
LAB_00b41a6a:
                if ((*puVar43 & 1) == 0 || bVar69) {
                  if ((*puVar43 & 1) != 0) goto LAB_00b41a7a;
                  goto LAB_00b41ad2;
                }
              }
            }
            bVar69 = uhugeint_t::operator>((uhugeint_t *)left->data,(uhugeint_t *)right->data);
            if (bVar69) {
LAB_00b41a7a:
              if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
                psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
                psVar14 = (true_sel.ptr)->sel_vector;
                iVar34 = 0;
                do {
                  sVar44 = (sel_t)iVar34;
                  if (psVar13 != (sel_t *)0x0) {
                    sVar44 = psVar13[iVar34];
                  }
                  psVar14[iVar34] = sVar44;
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
                return count;
              }
              return count;
            }
LAB_00b41ad2:
            if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return 0;
          }
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        uVar17 = LStack_490._0_8_;
        uVar20 = LStack_420._0_8_;
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b40fca;
              psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar46 = *(long *)local_498;
              psVar14 = *(sel_t **)local_428;
              lVar32 = 0;
              iVar34 = 0;
              do {
                iVar56 = iVar34;
                if (psVar13 != (sel_t *)0x0) {
                  iVar56 = (idx_t)psVar13[iVar34];
                }
                iVar49 = iVar34;
                if (lVar46 != 0) {
                  iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar48 = iVar34;
                if (psVar14 != (sel_t *)0x0) {
                  iVar48 = (idx_t)psVar14[iVar34];
                }
                bVar69 = uhugeint_t::operator>
                                   ((uhugeint_t *)(uVar17 + iVar49 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar48 * 0x10));
                if (!bVar69) {
                  (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
                  lVar32 = lVar32 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b40fcc;
            }
            if (count == 0) goto LAB_00b3b9a8;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar46 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4d0 = 0;
            do {
              iVar56 = iVar34;
              if (psVar13 != (sel_t *)0x0) {
                iVar56 = (idx_t)psVar13[iVar34];
              }
              iVar49 = iVar34;
              if (lVar46 != 0) {
                iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar48 = iVar34;
              if (psVar14 != (sel_t *)0x0) {
                iVar48 = (idx_t)psVar14[iVar34];
              }
              bVar69 = uhugeint_t::operator>
                                 ((uhugeint_t *)(uVar17 + iVar49 * 0x10),
                                  (uhugeint_t *)(uVar20 + iVar48 * 0x10));
              if (bVar69) {
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
                local_4d0 = local_4d0 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b3b9a8;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar46 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            local_4d0 = 0;
            iVar56 = 0;
            iVar34 = 0;
            do {
              iVar49 = iVar56;
              if (psVar13 != (sel_t *)0x0) {
                iVar49 = (idx_t)psVar13[iVar56];
              }
              iVar48 = iVar56;
              if (lVar46 != 0) {
                iVar48 = (idx_t)*(uint *)(lVar46 + iVar56 * 4);
              }
              iVar54 = iVar56;
              if (psVar14 != (sel_t *)0x0) {
                iVar54 = (idx_t)psVar14[iVar56];
              }
              bVar69 = uhugeint_t::operator>
                                 ((uhugeint_t *)(uVar17 + iVar48 * 0x10),
                                  (uhugeint_t *)(uVar20 + iVar54 * 0x10));
              if (bVar69) {
                iVar48 = local_4d0;
                oVar29.ptr = true_sel.ptr;
                iVar54 = iVar34;
                local_4d0 = local_4d0 + 1;
              }
              else {
                iVar54 = iVar34 + 1;
                iVar48 = iVar34;
                oVar29.ptr = false_sel.ptr;
              }
              (oVar29.ptr)->sel_vector[iVar48] = (sel_t)iVar49;
              iVar56 = iVar56 + 1;
              iVar34 = iVar54;
            } while (count != iVar56);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count != 0) {
              psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar46 = *(long *)local_498;
              psVar14 = *(sel_t **)local_428;
              lVar32 = 0;
              iVar34 = 0;
              do {
                iVar56 = iVar34;
                if (psVar13 != (sel_t *)0x0) {
                  iVar56 = (idx_t)psVar13[iVar34];
                }
                iVar49 = iVar34;
                if (lVar46 != 0) {
                  iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar48 = iVar34;
                if (psVar14 != (sel_t *)0x0) {
                  iVar48 = (idx_t)psVar14[iVar34];
                }
                if (LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  if (LStack_420.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      != (element_type *)0x0) {
                    bVar69 = false;
                    goto LAB_00b40f6a;
                  }
LAB_00b40f89:
                  bVar69 = uhugeint_t::operator>
                                     ((uhugeint_t *)(uVar17 + iVar49 * 0x10),
                                      (uhugeint_t *)(uVar20 + iVar48 * 0x10));
                  if (!bVar69) {
LAB_00b40fa4:
                    (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
                    lVar32 = lVar32 + 1;
                  }
                }
                else {
                  uVar67 = 1L << ((byte)iVar49 & 0x3f) &
                           *(ulong *)((long)LStack_490.type_info_.internal.
                                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + (iVar49 >> 6) * 8);
                  bVar69 = uVar67 == 0;
                  if (LStack_420.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      != (element_type *)0x0) {
LAB_00b40f6a:
                    uVar67 = 1L << ((byte)iVar48 & 0x3f) &
                             (ulong)(&(LStack_420.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6];
                    if ((!bVar69) && (uVar67 != 0)) goto LAB_00b40f89;
                    if (uVar67 != 0) goto LAB_00b40fb3;
                    goto LAB_00b40fa4;
                  }
                  if (uVar67 != 0) goto LAB_00b40f89;
                }
LAB_00b40fb3:
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b40fcc;
            }
            goto LAB_00b40fca;
          }
          if (count == 0) goto LAB_00b3b9a8;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4d0 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                bVar69 = false;
                goto LAB_00b3b93f;
              }
LAB_00b3b95e:
              bVar69 = uhugeint_t::operator>
                                 ((uhugeint_t *)(uVar17 + iVar49 * 0x10),
                                  (uhugeint_t *)(uVar20 + iVar48 * 0x10));
              if (bVar69) {
LAB_00b3b979:
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
                local_4d0 = local_4d0 + 1;
              }
            }
            else {
              uVar67 = 1L << ((byte)iVar49 & 0x3f) &
                       *(ulong *)((long)LStack_490.type_info_.internal.
                                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + (iVar49 >> 6) * 8);
              bVar69 = uVar67 == 0;
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                if (uVar67 != 0) goto LAB_00b3b95e;
                goto LAB_00b3b979;
              }
LAB_00b3b93f:
              uVar67 = 1L << ((byte)iVar48 & 0x3f) &
                       (ulong)(&(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6];
              if ((!bVar69) && (uVar67 != 0)) goto LAB_00b3b95e;
              if (uVar67 != 0) goto LAB_00b3b979;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b3b9a8;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          local_4d0 = 0;
          iVar56 = 0;
          iVar34 = 0;
          do {
            iVar49 = iVar56;
            if (psVar13 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar13[iVar56];
            }
            iVar48 = iVar56;
            if (lVar46 != 0) {
              iVar48 = (idx_t)*(uint *)(lVar46 + iVar56 * 4);
            }
            iVar54 = iVar56;
            if (psVar14 != (sel_t *)0x0) {
              iVar54 = (idx_t)psVar14[iVar56];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                bVar69 = false;
                goto LAB_00b391a1;
              }
LAB_00b391c0:
              bVar69 = uhugeint_t::operator>
                                 ((uhugeint_t *)(uVar17 + iVar48 * 0x10),
                                  (uhugeint_t *)(uVar20 + iVar54 * 0x10));
              if (bVar69) goto LAB_00b391ed;
LAB_00b391db:
              iVar54 = iVar34 + 1;
              iVar48 = iVar34;
              oVar29.ptr = false_sel.ptr;
            }
            else {
              uVar67 = 1L << ((byte)iVar48 & 0x3f) &
                       *(ulong *)((long)LStack_490.type_info_.internal.
                                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + (iVar48 >> 6) * 8);
              bVar69 = uVar67 == 0;
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
LAB_00b391a1:
                uVar67 = 1L << ((byte)iVar54 & 0x3f) &
                         (ulong)(&(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)[iVar54 >> 6];
                if ((!bVar69) && (uVar67 != 0)) goto LAB_00b391c0;
                if (uVar67 != 0) goto LAB_00b391ed;
                goto LAB_00b391db;
              }
              if (uVar67 != 0) goto LAB_00b391c0;
LAB_00b391ed:
              iVar48 = local_4d0;
              oVar29.ptr = true_sel.ptr;
              iVar54 = iVar34;
              local_4d0 = local_4d0 + 1;
            }
            (oVar29.ptr)->sel_vector[iVar48] = (sel_t)iVar49;
            iVar56 = iVar56 + 1;
            iVar34 = iVar54;
          } while (count != iVar56);
        }
        goto LAB_00b40fd9;
      }
      if (PVar1 != INT128) goto switchD_00b341be_caseD_a;
      local_288 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
        UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
        UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          pdVar9 = left->data;
          pdVar11 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          puVar12 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return 0;
            }
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            lVar46 = 8;
            lVar32 = 0;
            iVar34 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (puVar12 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              bVar65 = (bool)(bVar68 ^ 1);
              if (!bVar69 && bVar65 == false) {
                lVar47 = *(long *)(pdVar9 + lVar46);
                lVar52 = *(long *)(pdVar11 + lVar46);
                bVar69 = lVar47 == lVar52;
                bVar68 = *(ulong *)(pdVar11 + lVar46 + -8) < *(ulong *)(pdVar9 + lVar46 + -8) &&
                         bVar69 || !bVar69 && lVar52 <= lVar47;
                bVar65 = (*(ulong *)(pdVar9 + lVar46 + -8) <= *(ulong *)(pdVar11 + lVar46 + -8) ||
                         !bVar69) && (bVar69 || lVar52 > lVar47);
              }
              psVar14[iVar34] = (sel_t)uVar33;
              iVar34 = iVar34 + bVar68;
              psVar10[lVar32] = (sel_t)uVar33;
              lVar32 = lVar32 + (ulong)bVar65;
              uVar67 = uVar67 + 1;
              lVar46 = lVar46 + 0x10;
            } while (count != uVar67);
            return iVar34;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return 0;
            }
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            lVar46 = 8;
            uVar67 = 0;
            iVar34 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (puVar12 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                lVar32 = *(long *)(pdVar9 + lVar46);
                lVar47 = *(long *)(pdVar11 + lVar46);
                bVar68 = *(ulong *)(pdVar11 + lVar46 + -8) < *(ulong *)(pdVar9 + lVar46 + -8) &&
                         lVar32 == lVar47 || lVar32 != lVar47 && lVar47 <= lVar32;
              }
              psVar14[iVar34] = (sel_t)uVar33;
              iVar34 = iVar34 + bVar68;
              uVar67 = uVar67 + 1;
              lVar46 = lVar46 + 0x10;
            } while (count != uVar67);
            return iVar34;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar32 = 8;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (puVar12 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = (*(ulong *)(pdVar9 + lVar32 + -8) <= *(ulong *)(pdVar11 + lVar32 + -8) ||
                         *(long *)(pdVar9 + lVar32) != *(long *)(pdVar11 + lVar32)) &&
                         *(long *)(pdVar9 + lVar32) <= *(long *)(pdVar11 + lVar32);
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
              lVar32 = lVar32 + 0x10;
            } while (count != uVar67);
            goto LAB_00b4265e;
          }
          goto LAB_00b4265c;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar2 = (ulong *)right->data;
          puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          pdVar9 = left->data;
          _local_498 = (undefined1  [16])0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
            local_2f8._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_428,(unsigned_long *)&local_2f8);
            peVar18 = LStack_490.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar19 = local_428;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_420._0_8_;
            _local_428 = (undefined1  [16])0x0;
            auVar16 = _local_428;
            local_428[0] = auVar19[0];
            local_428[1] = auVar19[1];
            local_428._2_6_ = auVar19._2_6_;
            LStack_490.id_ = local_428[0];
            LStack_490.physical_type_ = local_428[1];
            LStack_490._2_6_ = local_428._2_6_;
            _local_428 = auVar16;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
              }
            }
            pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_498 + 8));
            local_498 = *(undefined1 (*) [8])
                         &(pTVar31->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>;
            *(undefined8 *)local_498 = 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(left);
          puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_490.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b4368c;
              psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              psVar14 = (false_sel.ptr)->sel_vector;
              puVar43 = (ulong *)(pdVar9 + 8);
              lVar46 = 0;
              uVar67 = 0;
              do {
                uVar33 = uVar67;
                if (psVar13 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar13[uVar67];
                }
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar68 = false;
                }
                else {
                  bVar68 = (*(byte *)local_498 & 1) == 0;
                }
                if (!bVar69 && bVar68 == false) {
                  bVar68 = (puVar43[-1] <= *puVar2 || *puVar43 != puVar2[1]) &&
                           (long)*puVar43 <= (long)puVar2[1];
                }
                psVar14[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)bVar68;
                uVar67 = uVar67 + 1;
                puVar43 = puVar43 + 2;
              } while (count != uVar67);
              goto LAB_00b4368e;
            }
            if (count != 0) {
              psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              psVar14 = (true_sel.ptr)->sel_vector;
              puVar43 = (ulong *)(pdVar9 + 8);
              uVar67 = 0;
              local_4d0 = 0;
              do {
                uVar33 = uVar67;
                if (psVar13 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar13[uVar67];
                }
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (bool)(*(byte *)local_498 & 1);
                }
                if (!bVar69 && bVar68 == true) {
                  uVar59 = *puVar43;
                  uVar58 = puVar2[1];
                  bVar68 = *puVar2 < puVar43[-1] && uVar59 == uVar58 ||
                           uVar59 != uVar58 && (long)uVar58 <= (long)uVar59;
                }
                psVar14[local_4d0] = (sel_t)uVar33;
                local_4d0 = local_4d0 + bVar68;
                uVar67 = uVar67 + 1;
                puVar43 = puVar43 + 2;
              } while (count != uVar67);
              goto LAB_00b4369b;
            }
          }
          else if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            puVar43 = (ulong *)(pdVar9 + 8);
            lVar46 = 0;
            local_4d0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              bVar65 = (bool)(bVar68 ^ 1);
              if (!bVar69 && bVar65 == false) {
                uVar59 = *puVar43;
                uVar58 = puVar2[1];
                bVar69 = uVar59 == uVar58;
                bVar68 = *puVar2 < puVar43[-1] && bVar69 || !bVar69 && (long)uVar58 <= (long)uVar59;
                bVar65 = (puVar43[-1] <= *puVar2 || !bVar69) &&
                         (bVar69 || (long)uVar58 > (long)uVar59);
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar65;
              uVar67 = uVar67 + 1;
              puVar43 = puVar43 + 2;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
          goto LAB_00b3fddf;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          puVar2 = (ulong *)left->data;
          puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          pdVar9 = right->data;
          _local_498 = (undefined1  [16])0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
            local_2f8._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_428,(unsigned_long *)&local_2f8);
            peVar18 = LStack_490.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar19 = local_428;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_420._0_8_;
            _local_428 = (undefined1  [16])0x0;
            auVar16 = _local_428;
            local_428[0] = auVar19[0];
            local_428[1] = auVar19[1];
            local_428._2_6_ = auVar19._2_6_;
            LStack_490.id_ = local_428[0];
            LStack_490.physical_type_ = local_428[1];
            LStack_490._2_6_ = local_428._2_6_;
            _local_428 = auVar16;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
              }
            }
            pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_498 + 8));
            local_498 = *(undefined1 (*) [8])
                         &(pTVar31->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>;
            *(undefined8 *)local_498 = 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(right);
          puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_490.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b4368c;
              psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              psVar14 = (false_sel.ptr)->sel_vector;
              puVar43 = (ulong *)(pdVar9 + 8);
              lVar46 = 0;
              uVar67 = 0;
              do {
                uVar33 = uVar67;
                if (psVar13 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar13[uVar67];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (*(byte *)local_498 & 1) == 0;
                }
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar68 = false;
                }
                else {
                  bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                }
                if (!bVar69 && bVar68 == false) {
                  bVar68 = (*puVar2 <= puVar43[-1] || puVar2[1] != *puVar43) &&
                           (long)puVar2[1] <= (long)*puVar43;
                }
                psVar14[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)bVar68;
                uVar67 = uVar67 + 1;
                puVar43 = puVar43 + 2;
              } while (count != uVar67);
              goto LAB_00b4368e;
            }
            if (count != 0) {
              psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              psVar14 = (true_sel.ptr)->sel_vector;
              puVar43 = (ulong *)(pdVar9 + 8);
              uVar67 = 0;
              local_4d0 = 0;
              do {
                uVar33 = uVar67;
                if (psVar13 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar13[uVar67];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (*(byte *)local_498 & 1) == 0;
                }
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
                }
                if (!bVar69 && bVar68 == true) {
                  uVar59 = puVar2[1];
                  uVar58 = *puVar43;
                  bVar68 = puVar43[-1] < *puVar2 && uVar59 == uVar58 ||
                           uVar59 != uVar58 && (long)uVar58 <= (long)uVar59;
                }
                psVar14[local_4d0] = (sel_t)uVar33;
                local_4d0 = local_4d0 + bVar68;
                uVar67 = uVar67 + 1;
                puVar43 = puVar43 + 2;
              } while (count != uVar67);
              goto LAB_00b4369b;
            }
          }
          else if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            puVar43 = (ulong *)(pdVar9 + 8);
            lVar46 = 0;
            local_4d0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              bVar65 = (bool)(bVar68 ^ 1);
              if (!bVar69 && bVar65 == false) {
                uVar59 = puVar2[1];
                uVar58 = *puVar43;
                bVar69 = uVar59 == uVar58;
                bVar68 = puVar43[-1] < *puVar2 && bVar69 || !bVar69 && (long)uVar58 <= (long)uVar59;
                bVar65 = (*puVar2 <= puVar43[-1] || !bVar69) &&
                         (bVar69 || (long)uVar58 > (long)uVar59);
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar65;
              uVar67 = uVar67 + 1;
              puVar43 = puVar43 + 2;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
          goto LAB_00b3fddf;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar2 == (ulong *)0x0) {
            if (puVar43 != (ulong *)0x0) {
              bVar69 = false;
              goto LAB_00b41b24;
            }
          }
          else {
            uVar67 = *puVar2;
            bVar69 = (uVar67 & 1) == 0;
            if (puVar43 == (ulong *)0x0) {
              if ((uVar67 & 1) == 0) goto LAB_00b41ba3;
            }
            else {
LAB_00b41b24:
              if ((*puVar43 & 1) == 0 || bVar69) {
                if ((*puVar43 & 1) != 0) goto LAB_00b41ba3;
                goto LAB_00b41b5a;
              }
            }
          }
          uVar67 = *(ulong *)((long)left->data + 8);
          uVar33 = *(ulong *)((long)right->data + 8);
          if (((long)uVar33 < (long)uVar67) ||
             (*(ulong *)right->data < *(ulong *)left->data && uVar67 == uVar33)) {
LAB_00b41ba3:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar34 = 0;
              do {
                sVar44 = (sel_t)iVar34;
                if (psVar13 != (sel_t *)0x0) {
                  sVar44 = psVar13[iVar34];
                }
                psVar14[iVar34] = sVar44;
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              return count;
            }
            return count;
          }
LAB_00b41b5a:
          if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar44 = (sel_t)iVar34;
            if (psVar13 != (sel_t *)0x0) {
              sVar44 = psVar13[iVar34];
            }
            psVar14[iVar34] = sVar44;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return 0;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
      Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
      Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
      if (LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0 &&
          LStack_420.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b3bb5a;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          iVar49 = 0;
          iVar34 = 0;
          iVar56 = 0;
          do {
            iVar48 = iVar49;
            if (psVar13 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar13[iVar49];
            }
            iVar54 = iVar49;
            if (lVar46 != 0) {
              iVar54 = (idx_t)*(uint *)(lVar46 + iVar49 * 4);
            }
            iVar37 = iVar49;
            if (psVar14 != (sel_t *)0x0) {
              iVar37 = (idx_t)psVar14[iVar49];
            }
            if ((*(long *)(LStack_420._0_8_ + iVar37 * 0x10 + 8) <
                 *(long *)(LStack_490._0_8_ + (iVar54 * 2 + 1) * 8)) ||
               (*(ulong *)(LStack_420._0_8_ + iVar37 * 0x10) <
                *(ulong *)(LStack_490._0_8_ + iVar54 * 0x10) &&
                *(long *)(LStack_490._0_8_ + (iVar54 * 2 + 1) * 8) ==
                *(long *)(LStack_420._0_8_ + iVar37 * 0x10 + 8))) {
              local_4d0 = iVar56 + 1;
              oVar29.ptr = true_sel.ptr;
              iVar54 = iVar34;
              iVar34 = iVar56;
            }
            else {
              oVar29.ptr = false_sel.ptr;
              iVar54 = iVar34 + 1;
              local_4d0 = iVar56;
            }
            (oVar29.ptr)->sel_vector[iVar34] = (sel_t)iVar48;
            iVar49 = iVar49 + 1;
            iVar34 = iVar54;
            iVar56 = local_4d0;
          } while (count != iVar49);
        }
        else {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b410ab;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar46 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            lVar32 = 0;
            iVar34 = 0;
            do {
              iVar56 = iVar34;
              if (psVar13 != (sel_t *)0x0) {
                iVar56 = (idx_t)psVar13[iVar34];
              }
              iVar49 = iVar34;
              if (lVar46 != 0) {
                iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar48 = iVar34;
              if (psVar14 != (sel_t *)0x0) {
                iVar48 = (idx_t)psVar14[iVar34];
              }
              if ((*(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) <=
                   *(long *)(LStack_420._0_8_ + iVar48 * 0x10 + 8)) &&
                 (*(ulong *)(LStack_490._0_8_ + iVar49 * 0x10) <=
                  *(ulong *)(LStack_420._0_8_ + iVar48 * 0x10) ||
                  *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) !=
                  *(long *)(LStack_420._0_8_ + iVar48 * 0x10 + 8))) {
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
                lVar32 = lVar32 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b410ad;
          }
          if (count == 0) goto LAB_00b3bb5a;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4d0 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            if ((*(long *)(LStack_420._0_8_ + iVar48 * 0x10 + 8) <
                 *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8)) ||
               (*(ulong *)(LStack_420._0_8_ + iVar48 * 0x10) <
                *(ulong *)(LStack_490._0_8_ + iVar49 * 0x10) &&
                *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) ==
                *(long *)(LStack_420._0_8_ + iVar48 * 0x10 + 8))) {
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
              local_4d0 = local_4d0 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
      }
      else if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        uVar67 = 0;
        iVar34 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              bVar69 = false;
              goto LAB_00b392a3;
            }
LAB_00b392c3:
            uVar57 = ((ulong *)(LStack_490._0_8_ + uVar59 * 0x10))[1];
            uVar50 = ((ulong *)(LStack_420._0_8_ + uVar58 * 0x10))[1];
            if (((long)uVar50 < (long)uVar57) ||
               (*(ulong *)(LStack_420._0_8_ + uVar58 * 0x10) <
                *(ulong *)(LStack_490._0_8_ + uVar59 * 0x10) && uVar57 == uVar50))
            goto LAB_00b39307;
LAB_00b392f5:
            iVar49 = iVar34 + 1;
            iVar56 = iVar34;
            oVar29.ptr = false_sel.ptr;
          }
          else {
            uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                     *(ulong *)((long)LStack_490.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + (uVar59 >> 6) * 8);
            bVar69 = uVar57 == 0;
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
LAB_00b392a3:
              uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                       (ulong)(&(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
              if ((!bVar69) && (uVar57 != 0)) goto LAB_00b392c3;
              if (uVar57 != 0) goto LAB_00b39307;
              goto LAB_00b392f5;
            }
            if (uVar57 != 0) goto LAB_00b392c3;
LAB_00b39307:
            iVar56 = local_4d0;
            oVar29.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
            iVar49 = iVar34;
          }
          (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
          uVar67 = uVar67 + 1;
          iVar34 = iVar49;
        } while (count != uVar67);
      }
      else {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b411a6;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            uVar59 = uVar67;
            if (lVar46 != 0) {
              uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
            }
            uVar58 = uVar67;
            if (psVar14 != (sel_t *)0x0) {
              uVar58 = (ulong)psVar14[uVar67];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                bVar69 = false;
                goto LAB_00b41130;
              }
LAB_00b41150:
              uVar57 = ((ulong *)(LStack_490._0_8_ + uVar59 * 0x10))[1];
              uVar50 = ((ulong *)(LStack_420._0_8_ + uVar58 * 0x10))[1];
              if ((long)uVar57 <= (long)uVar50) {
                bVar69 = *(ulong *)(LStack_490._0_8_ + uVar59 * 0x10) <=
                         *(ulong *)(LStack_420._0_8_ + uVar58 * 0x10) || uVar57 != uVar50;
LAB_00b41185:
                if (bVar69) {
                  (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
                  lVar32 = lVar32 + 1;
                }
              }
            }
            else {
              uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                       *(ulong *)((long)LStack_490.type_info_.internal.
                                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + (uVar59 >> 6) * 8);
              bVar69 = uVar57 == 0;
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
LAB_00b41130:
                uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                         (ulong)(&(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
                if ((!bVar69) && (uVar57 != 0)) goto LAB_00b41150;
                bVar69 = uVar57 == 0;
                goto LAB_00b41185;
              }
              if (uVar57 != 0) goto LAB_00b41150;
            }
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b411a9;
        }
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        uVar67 = 0;
        local_4d0 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              bVar69 = false;
              goto LAB_00b3badd;
            }
LAB_00b3bafd:
            uVar57 = ((ulong *)(LStack_490._0_8_ + uVar59 * 0x10))[1];
            uVar50 = ((ulong *)(LStack_420._0_8_ + uVar58 * 0x10))[1];
            if (((long)uVar50 < (long)uVar57) ||
               (*(ulong *)(LStack_420._0_8_ + uVar58 * 0x10) <
                *(ulong *)(LStack_490._0_8_ + uVar59 * 0x10) && uVar57 == uVar50)) {
LAB_00b3bb39:
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + 1;
            }
          }
          else {
            uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                     *(ulong *)((long)LStack_490.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + (uVar59 >> 6) * 8);
            bVar69 = uVar57 == 0;
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              if (uVar57 != 0) goto LAB_00b3bafd;
              goto LAB_00b3bb39;
            }
LAB_00b3badd:
            uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
            if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3bafd;
            if (uVar57 != 0) goto LAB_00b3bb39;
          }
          uVar67 = uVar67 + 1;
        } while (count != uVar67);
      }
      goto LAB_00b411b1;
    }
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar40 = (string_t *)left->data;
        psVar63 = (string_t *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar63);
              bVar65 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
            psVar40 = psVar40 + 1;
            psVar63 = psVar63 + 1;
          } while (count != uVar67);
          return local_4d0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          uVar67 = 0;
          local_4d0 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar63);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            uVar67 = uVar67 + 1;
            psVar40 = psVar40 + 1;
            psVar63 = psVar63 + 1;
          } while (count != uVar67);
          return local_4d0;
        }
        if (count != 0) {
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar63);
              bVar68 = !bVar68;
            }
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar68;
            uVar67 = uVar67 + 1;
            psVar40 = psVar40 + 1;
            psVar63 = psVar63 + 1;
          } while (count != uVar67);
          goto LAB_00b4259b;
        }
        goto LAB_00b42598;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        psVar40 = (string_t *)right->data;
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar63 = (string_t *)left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b434b0;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar67];
              }
              puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar63,psVar40);
                bVar68 = !bVar68;
              }
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
              psVar63 = psVar63 + 1;
            } while (count != uVar67);
            goto LAB_00b434b3;
          }
          if (count != 0) {
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar67];
              }
              puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar63,psVar40);
              }
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
              psVar63 = psVar63 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar67);
            goto LAB_00b43709;
          }
        }
        else if (count != 0) {
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar63,psVar40);
              bVar65 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
            psVar63 = psVar63 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar67);
          goto LAB_00b43709;
        }
        goto LAB_00b3fc75;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar40 = (string_t *)left->data;
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar63 = (string_t *)right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b43544;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar63);
                bVar68 = !bVar68;
              }
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
              psVar63 = psVar63 + 1;
            } while (count != uVar67);
            goto LAB_00b43547;
          }
          if (count != 0) {
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar63);
              }
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
              psVar63 = psVar63 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar67);
            goto LAB_00b43709;
          }
        }
        else if (count != 0) {
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar63);
              bVar65 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
            psVar63 = psVar63 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar67);
          goto LAB_00b43709;
        }
        goto LAB_00b3fc75;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (ulong *)0x0) {
          if (puVar43 != (ulong *)0x0) {
            bVar69 = false;
            goto LAB_00b419bb;
          }
        }
        else {
          uVar67 = *puVar2;
          bVar69 = (uVar67 & 1) == 0;
          if (puVar43 == (ulong *)0x0) {
            if ((uVar67 & 1) == 0) goto LAB_00b419cb;
          }
          else {
LAB_00b419bb:
            if ((*puVar43 & 1) == 0 || bVar69) {
              if ((*puVar43 & 1) != 0) goto LAB_00b419cb;
              goto LAB_00b41a18;
            }
          }
        }
        bVar69 = string_t::StringComparisonOperators::GreaterThan
                           ((string_t *)left->data,(string_t *)right->data);
        if (bVar69) {
LAB_00b419cb:
          if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
LAB_00b41a18:
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          psVar14[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    uVar17 = LStack_490._0_8_;
    uVar20 = LStack_420._0_8_;
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b40fca;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          iVar34 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            bVar69 = string_t::StringComparisonOperators::GreaterThan
                               ((string_t *)(uVar17 + iVar49 * 0x10),
                                (string_t *)(uVar20 + iVar48 * 0x10));
            if (!bVar69) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
              lVar32 = lVar32 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          goto LAB_00b40fcc;
        }
        if (count == 0) goto LAB_00b3b9a8;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar34 = 0;
        local_4d0 = 0;
        do {
          iVar56 = iVar34;
          if (psVar13 != (sel_t *)0x0) {
            iVar56 = (idx_t)psVar13[iVar34];
          }
          iVar49 = iVar34;
          if (lVar46 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
          }
          iVar48 = iVar34;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar34];
          }
          bVar69 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)(uVar17 + iVar49 * 0x10),
                              (string_t *)(uVar20 + iVar48 * 0x10));
          if (bVar69) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
            local_4d0 = local_4d0 + 1;
          }
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
      else {
        if (count == 0) goto LAB_00b3b9a8;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        iVar56 = 0;
        iVar34 = 0;
        do {
          iVar49 = iVar56;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar56];
          }
          iVar48 = iVar56;
          if (lVar46 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar46 + iVar56 * 4);
          }
          iVar54 = iVar56;
          if (psVar14 != (sel_t *)0x0) {
            iVar54 = (idx_t)psVar14[iVar56];
          }
          bVar69 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)(uVar17 + iVar48 * 0x10),
                              (string_t *)(uVar20 + iVar54 * 0x10));
          if (bVar69) {
            iVar48 = local_4d0;
            oVar29.ptr = true_sel.ptr;
            iVar54 = iVar34;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar54 = iVar34 + 1;
            iVar48 = iVar34;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar48] = (sel_t)iVar49;
          iVar56 = iVar56 + 1;
          iVar34 = iVar54;
        } while (count != iVar56);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          iVar34 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                bVar69 = false;
                goto LAB_00b40e03;
              }
LAB_00b40e22:
              bVar69 = string_t::StringComparisonOperators::GreaterThan
                                 ((string_t *)(uVar17 + iVar49 * 0x10),
                                  (string_t *)(uVar20 + iVar48 * 0x10));
              if (!bVar69) {
LAB_00b40e3d:
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
                lVar32 = lVar32 + 1;
              }
            }
            else {
              uVar67 = 1L << ((byte)iVar49 & 0x3f) &
                       *(ulong *)((long)LStack_490.type_info_.internal.
                                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + (iVar49 >> 6) * 8);
              bVar69 = uVar67 == 0;
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
LAB_00b40e03:
                uVar67 = 1L << ((byte)iVar48 & 0x3f) &
                         (ulong)(&(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6];
                if ((!bVar69) && (uVar67 != 0)) goto LAB_00b40e22;
                if (uVar67 != 0) goto LAB_00b40e4c;
                goto LAB_00b40e3d;
              }
              if (uVar67 != 0) goto LAB_00b40e22;
            }
LAB_00b40e4c:
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          goto LAB_00b40fcc;
        }
        goto LAB_00b40fca;
      }
      if (count == 0) goto LAB_00b3b9a8;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar34 = 0;
      local_4d0 = 0;
      do {
        iVar56 = iVar34;
        if (psVar13 != (sel_t *)0x0) {
          iVar56 = (idx_t)psVar13[iVar34];
        }
        iVar49 = iVar34;
        if (lVar46 != 0) {
          iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
        }
        iVar48 = iVar34;
        if (psVar14 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar14[iVar34];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b3b7a5;
          }
LAB_00b3b7c4:
          bVar69 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)(uVar17 + iVar49 * 0x10),
                              (string_t *)(uVar20 + iVar48 * 0x10));
          if (bVar69) {
LAB_00b3b7df:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
            local_4d0 = local_4d0 + 1;
          }
        }
        else {
          uVar67 = 1L << ((byte)iVar49 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (iVar49 >> 6) * 8);
          bVar69 = uVar67 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (uVar67 != 0) goto LAB_00b3b7c4;
            goto LAB_00b3b7df;
          }
LAB_00b3b7a5:
          uVar67 = 1L << ((byte)iVar48 & 0x3f) &
                   (ulong)(&(LStack_420.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6];
          if ((!bVar69) && (uVar67 != 0)) goto LAB_00b3b7c4;
          if (uVar67 != 0) goto LAB_00b3b7df;
        }
        iVar34 = iVar34 + 1;
      } while (count != iVar34);
    }
    else {
      if (count == 0) goto LAB_00b3b9a8;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      iVar56 = 0;
      iVar34 = 0;
      do {
        iVar49 = iVar56;
        if (psVar13 != (sel_t *)0x0) {
          iVar49 = (idx_t)psVar13[iVar56];
        }
        iVar48 = iVar56;
        if (lVar46 != 0) {
          iVar48 = (idx_t)*(uint *)(lVar46 + iVar56 * 4);
        }
        iVar54 = iVar56;
        if (psVar14 != (sel_t *)0x0) {
          iVar54 = (idx_t)psVar14[iVar56];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b39086;
          }
LAB_00b390a5:
          bVar69 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)(uVar17 + iVar48 * 0x10),
                              (string_t *)(uVar20 + iVar54 * 0x10));
          if (bVar69) goto LAB_00b390d2;
LAB_00b390c0:
          iVar54 = iVar34 + 1;
          iVar48 = iVar34;
          oVar29.ptr = false_sel.ptr;
        }
        else {
          uVar67 = 1L << ((byte)iVar48 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (iVar48 >> 6) * 8);
          bVar69 = uVar67 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
LAB_00b39086:
            uVar67 = 1L << ((byte)iVar54 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[iVar54 >> 6];
            if ((!bVar69) && (uVar67 != 0)) goto LAB_00b390a5;
            if (uVar67 != 0) goto LAB_00b390d2;
            goto LAB_00b390c0;
          }
          if (uVar67 != 0) goto LAB_00b390a5;
LAB_00b390d2:
          iVar48 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          iVar54 = iVar34;
          local_4d0 = local_4d0 + 1;
        }
        (oVar29.ptr)->sel_vector[iVar48] = (sel_t)iVar49;
        iVar56 = iVar56 + 1;
        iVar34 = iVar54;
      } while (count != iVar56);
    }
    goto LAB_00b40fd9;
  }
  switch(PVar1) {
  case BOOL:
  case INT8:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar11 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar12 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = (char)pdVar11[uVar67] < (char)pdVar9[uVar67];
              bVar65 = (char)pdVar9[uVar67] <= (char)pdVar11[uVar67];
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              bVar68 = (char)pdVar11[uVar67] < (char)pdVar9[uVar67];
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = (char)pdVar9[uVar67] <= (char)pdVar11[uVar67];
            }
            psVar14[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4265e;
        }
LAB_00b4265c:
        lVar46 = 0;
LAB_00b4265e:
        return count - lVar46;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar9 = right->data;
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar11 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = (char)pdVar11[uVar67] <= (char)*pdVar9;
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = (char)*pdVar9 < (char)pdVar11[uVar67];
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = (char)*pdVar9 < (char)pdVar11[uVar67];
              bVar65 = (char)pdVar11[uVar67] <= (char)*pdVar9;
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar11 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_00b4368c:
              lVar46 = 0;
            }
            else {
              psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              psVar14 = (false_sel.ptr)->sel_vector;
              lVar46 = 0;
              uVar67 = 0;
              do {
                uVar33 = uVar67;
                if (psVar13 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar13[uVar67];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (*(byte *)local_498 & 1) == 0;
                }
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar68 = false;
                }
                else {
                  bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                }
                if (!bVar69 && bVar68 == false) {
                  bVar68 = (char)*pdVar9 <= (char)pdVar11[uVar67];
                }
                psVar14[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)bVar68;
                uVar67 = uVar67 + 1;
              } while (count != uVar67);
            }
LAB_00b4368e:
            local_4d0 = count - lVar46;
            local_118.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_00b4369b;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = (char)pdVar11[uVar67] < (char)*pdVar9;
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = (char)pdVar11[uVar67] < (char)*pdVar9;
              bVar65 = (char)*pdVar9 <= (char)pdVar11[uVar67];
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
LAB_00b3fddf:
        local_4d0 = 0;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        goto LAB_00b4369b;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (ulong *)0x0) {
          if (puVar43 != (ulong *)0x0) {
            bVar69 = false;
            goto LAB_00b3e117;
          }
        }
        else {
          uVar67 = *puVar2;
          bVar69 = (uVar67 & 1) == 0;
          if (puVar43 == (ulong *)0x0) {
            if ((uVar67 & 1) == 0) goto LAB_00b3e12b;
          }
          else {
LAB_00b3e117:
            if ((*puVar43 & 1) == 0 || bVar69) {
              if ((*puVar43 & 1) != 0) goto LAB_00b3e12b;
              goto LAB_00b3e175;
            }
          }
        }
        if ((char)*right->data < (char)*left->data) {
LAB_00b3e12b:
          if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
LAB_00b3e175:
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          psVar14[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b410ab;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          iVar34 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            if ((char)*(data_ptr_t)(LStack_490._0_8_ + iVar49) <=
                (char)*(data_ptr_t)(LStack_420._0_8_ + iVar48)) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
              lVar32 = lVar32 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
LAB_00b410ad:
          local_4d0 = count - lVar32;
        }
        else {
          if (count == 0) goto LAB_00b3bb5a;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          local_4d0 = 0;
          iVar34 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            if ((char)*(data_ptr_t)(LStack_420._0_8_ + iVar48) <
                (char)*(data_ptr_t)(LStack_490._0_8_ + iVar49)) {
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
              local_4d0 = local_4d0 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
      }
      else if (count == 0) {
LAB_00b3bb5a:
        local_4d0 = 0;
      }
      else {
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        iVar56 = 0;
        iVar34 = 0;
        do {
          iVar49 = iVar56;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar56];
          }
          iVar48 = iVar56;
          if (lVar46 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar46 + iVar56 * 4);
          }
          iVar54 = iVar56;
          if (psVar14 != (sel_t *)0x0) {
            iVar54 = (idx_t)psVar14[iVar56];
          }
          if ((char)*(data_ptr_t)(LStack_420._0_8_ + iVar54) <
              (char)*(data_ptr_t)(LStack_490._0_8_ + iVar48)) {
            oVar29.ptr = true_sel.ptr;
            iVar48 = iVar34;
            iVar34 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar48 = iVar34 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar34] = (sel_t)iVar49;
          iVar56 = iVar56 + 1;
          iVar34 = iVar48;
        } while (count != iVar56);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b411a6;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar32 = 0;
        uVar67 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              bVar69 = false;
              goto LAB_00b3e0b5;
            }
LAB_00b3e0d5:
            if ((char)*(data_ptr_t)(LStack_490._0_8_ + uVar59) <=
                (char)*(data_ptr_t)(LStack_420._0_8_ + uVar58)) {
LAB_00b3e0e7:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
              lVar32 = lVar32 + 1;
            }
          }
          else {
            uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                     *(ulong *)((long)LStack_490.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + (uVar59 >> 6) * 8);
            bVar69 = uVar57 == 0;
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
LAB_00b3e0b5:
              uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                       (ulong)(&(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
              if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3e0d5;
              if (uVar57 != 0) goto LAB_00b3e0f6;
              goto LAB_00b3e0e7;
            }
            if (uVar57 != 0) goto LAB_00b3e0d5;
          }
LAB_00b3e0f6:
          uVar67 = uVar67 + 1;
        } while (count != uVar67);
LAB_00b411a9:
        local_4d0 = count - lVar32;
      }
      else {
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        uVar67 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              bVar69 = false;
              goto LAB_00b38dac;
            }
LAB_00b38dcc:
            if ((char)*(data_ptr_t)(LStack_420._0_8_ + uVar58) <
                (char)*(data_ptr_t)(LStack_490._0_8_ + uVar59)) {
LAB_00b38de8:
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + 1;
            }
          }
          else {
            uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                     *(ulong *)((long)LStack_490.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + (uVar59 >> 6) * 8);
            bVar69 = uVar57 == 0;
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              if (uVar57 != 0) goto LAB_00b38dcc;
              goto LAB_00b38de8;
            }
LAB_00b38dac:
            uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
            if ((!bVar69) && (uVar57 != 0)) goto LAB_00b38dcc;
            if (uVar57 != 0) goto LAB_00b38de8;
          }
          uVar67 = uVar67 + 1;
        } while (count != uVar67);
      }
    }
    else {
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      iVar34 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b35cee;
          }
LAB_00b35d0e:
          if ((char)*(data_ptr_t)(LStack_420._0_8_ + uVar58) <
              (char)*(data_ptr_t)(LStack_490._0_8_ + uVar59)) goto LAB_00b35d32;
LAB_00b35d20:
          iVar49 = iVar34 + 1;
          iVar56 = iVar34;
          oVar29.ptr = false_sel.ptr;
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
LAB_00b35cee:
            uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
            if ((!bVar69) && (uVar57 != 0)) goto LAB_00b35d0e;
            if (uVar57 != 0) goto LAB_00b35d32;
            goto LAB_00b35d20;
          }
          if (uVar57 != 0) goto LAB_00b35d0e;
LAB_00b35d32:
          iVar56 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
          iVar49 = iVar34;
        }
        (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
        uVar67 = uVar67 + 1;
        iVar34 = iVar49;
      } while (count != uVar67);
    }
    break;
  case UINT8:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar11 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar12 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = pdVar11[uVar67] < pdVar9[uVar67];
              bVar65 = pdVar9[uVar67] <= pdVar11[uVar67];
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              bVar68 = pdVar11[uVar67] < pdVar9[uVar67];
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = pdVar9[uVar67] <= pdVar11[uVar67];
            }
            psVar14[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4265e;
        }
        goto LAB_00b4265c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pbVar7 = right->data;
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = pdVar9[uVar67] <= *pbVar7;
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *pbVar7 < pdVar9[uVar67];
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *pbVar7 < pdVar9[uVar67];
              bVar65 = pdVar9[uVar67] <= *pbVar7;
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pbVar7 = left->data;
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *pbVar7 <= pdVar9[uVar67];
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = pdVar9[uVar67] < *pbVar7;
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = pdVar9[uVar67] < *pbVar7;
              bVar65 = *pbVar7 <= pdVar9[uVar67];
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (ulong *)0x0) {
          if (puVar43 != (ulong *)0x0) {
            bVar69 = false;
            goto LAB_00b417d3;
          }
        }
        else {
          uVar67 = *puVar2;
          bVar69 = (uVar67 & 1) == 0;
          if (puVar43 == (ulong *)0x0) {
            if ((uVar67 & 1) == 0) goto LAB_00b417e7;
          }
          else {
LAB_00b417d3:
            if ((*puVar43 & 1) == 0 || bVar69) {
              if ((*puVar43 & 1) != 0) goto LAB_00b417e7;
              goto LAB_00b41831;
            }
          }
        }
        if (*right->data < *left->data) {
LAB_00b417e7:
          if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
LAB_00b41831:
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          psVar14[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        iVar56 = 0;
        iVar34 = 0;
        do {
          iVar49 = iVar56;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar56];
          }
          iVar48 = iVar56;
          if (lVar46 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar46 + iVar56 * 4);
          }
          iVar54 = iVar56;
          if (psVar14 != (sel_t *)0x0) {
            iVar54 = (idx_t)psVar14[iVar56];
          }
          if (*(byte *)(LStack_420._0_8_ + iVar54) < *(byte *)(LStack_490._0_8_ + iVar48)) {
            oVar29.ptr = true_sel.ptr;
            iVar48 = iVar34;
            iVar34 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar48 = iVar34 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar34] = (sel_t)iVar49;
          iVar56 = iVar56 + 1;
          iVar34 = iVar48;
        } while (count != iVar56);
      }
      else {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b410ab;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          iVar34 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            if (*(byte *)(LStack_490._0_8_ + iVar49) <= *(byte *)(LStack_420._0_8_ + iVar48)) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
              lVar32 = lVar32 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          goto LAB_00b410ad;
        }
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar34 = 0;
        local_4d0 = 0;
        do {
          iVar56 = iVar34;
          if (psVar13 != (sel_t *)0x0) {
            iVar56 = (idx_t)psVar13[iVar34];
          }
          iVar49 = iVar34;
          if (lVar46 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
          }
          iVar48 = iVar34;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar34];
          }
          if (*(byte *)(LStack_420._0_8_ + iVar48) < *(byte *)(LStack_490._0_8_ + iVar49)) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
            local_4d0 = local_4d0 + 1;
          }
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
    }
    else if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      iVar34 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b38e8f;
          }
LAB_00b38eaf:
          if (*(byte *)(LStack_420._0_8_ + uVar58) < *(byte *)(LStack_490._0_8_ + uVar59))
          goto LAB_00b38ed3;
LAB_00b38ec1:
          iVar49 = iVar34 + 1;
          iVar56 = iVar34;
          oVar29.ptr = false_sel.ptr;
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
LAB_00b38e8f:
            uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
            if ((!bVar69) && (uVar57 != 0)) goto LAB_00b38eaf;
            if (uVar57 != 0) goto LAB_00b38ed3;
            goto LAB_00b38ec1;
          }
          if (uVar57 != 0) goto LAB_00b38eaf;
LAB_00b38ed3:
          iVar56 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
          iVar49 = iVar34;
        }
        (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
        uVar67 = uVar67 + 1;
        iVar34 = iVar49;
      } while (count != uVar67);
    }
    else {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b411a6;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar32 = 0;
        uVar67 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              bVar69 = false;
              goto LAB_00b40b60;
            }
LAB_00b40b80:
            if (*(byte *)(LStack_490._0_8_ + uVar59) <= *(byte *)(LStack_420._0_8_ + uVar58)) {
LAB_00b40b92:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
              lVar32 = lVar32 + 1;
            }
          }
          else {
            uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                     *(ulong *)((long)LStack_490.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + (uVar59 >> 6) * 8);
            bVar69 = uVar57 == 0;
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
LAB_00b40b60:
              uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                       (ulong)(&(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
              if ((!bVar69) && (uVar57 != 0)) goto LAB_00b40b80;
              if (uVar57 != 0) goto LAB_00b40ba1;
              goto LAB_00b40b92;
            }
            if (uVar57 != 0) goto LAB_00b40b80;
          }
LAB_00b40ba1:
          uVar67 = uVar67 + 1;
        } while (count != uVar67);
        goto LAB_00b411a9;
      }
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      uVar67 = 0;
      local_4d0 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b3b4b6;
          }
LAB_00b3b4d6:
          if (*(byte *)(LStack_420._0_8_ + uVar58) < *(byte *)(LStack_490._0_8_ + uVar59)) {
LAB_00b3b4f2:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + 1;
          }
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (uVar57 != 0) goto LAB_00b3b4d6;
            goto LAB_00b3b4f2;
          }
LAB_00b3b4b6:
          uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                   (ulong)(&(LStack_420.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
          if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3b4d6;
          if (uVar57 != 0) goto LAB_00b3b4f2;
        }
        uVar67 = uVar67 + 1;
      } while (count != uVar67);
    }
    break;
  case UINT16:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar11 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar12 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          iVar34 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *(ushort *)(pdVar11 + uVar67 * 2) < *(ushort *)(pdVar9 + uVar67 * 2);
              bVar65 = *(ushort *)(pdVar9 + uVar67 * 2) <= *(ushort *)(pdVar11 + uVar67 * 2);
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          uVar67 = 0;
          iVar34 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              bVar68 = *(ushort *)(pdVar11 + uVar67 * 2) < *(ushort *)(pdVar9 + uVar67 * 2);
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = *(ushort *)(pdVar9 + uVar67 * 2) <= *(ushort *)(pdVar11 + uVar67 * 2);
            }
            psVar14[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4265e;
        }
        goto LAB_00b4265c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar6 = (ushort *)right->data;
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *(ushort *)(pdVar9 + uVar67 * 2) <= *puVar6;
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *puVar6 < *(ushort *)(pdVar9 + uVar67 * 2);
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *puVar6 < *(ushort *)(pdVar9 + uVar67 * 2);
              bVar65 = *(ushort *)(pdVar9 + uVar67 * 2) <= *puVar6;
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        puVar6 = (ushort *)left->data;
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *puVar6 <= *(ushort *)(pdVar9 + uVar67 * 2);
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *(ushort *)(pdVar9 + uVar67 * 2) < *puVar6;
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *(ushort *)(pdVar9 + uVar67 * 2) < *puVar6;
              bVar65 = *puVar6 <= *(ushort *)(pdVar9 + uVar67 * 2);
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (ulong *)0x0) {
          if (puVar43 != (ulong *)0x0) {
            bVar69 = false;
            goto LAB_00b4167b;
          }
        }
        else {
          uVar67 = *puVar2;
          bVar69 = (uVar67 & 1) == 0;
          if (puVar43 == (ulong *)0x0) {
            if ((uVar67 & 1) == 0) goto LAB_00b4168f;
          }
          else {
LAB_00b4167b:
            if ((*puVar43 & 1) == 0 || bVar69) {
              if ((*puVar43 & 1) != 0) goto LAB_00b4168f;
              goto LAB_00b416db;
            }
          }
        }
        if (*(ushort *)right->data < *(ushort *)left->data) {
LAB_00b4168f:
          if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
LAB_00b416db:
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          psVar14[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b410ab;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          iVar34 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            if (*(ushort *)(LStack_490._0_8_ + iVar49 * 2) <=
                *(ushort *)(LStack_420._0_8_ + iVar48 * 2)) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
              lVar32 = lVar32 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          goto LAB_00b410ad;
        }
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar34 = 0;
        local_4d0 = 0;
        do {
          iVar56 = iVar34;
          if (psVar13 != (sel_t *)0x0) {
            iVar56 = (idx_t)psVar13[iVar34];
          }
          iVar49 = iVar34;
          if (lVar46 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
          }
          iVar48 = iVar34;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar34];
          }
          if (*(ushort *)(LStack_420._0_8_ + iVar48 * 2) <
              *(ushort *)(LStack_490._0_8_ + iVar49 * 2)) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
            local_4d0 = local_4d0 + 1;
          }
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
      else {
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        iVar56 = 0;
        iVar34 = 0;
        do {
          iVar49 = iVar56;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar56];
          }
          iVar48 = iVar56;
          if (lVar46 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar46 + iVar56 * 4);
          }
          iVar54 = iVar56;
          if (psVar14 != (sel_t *)0x0) {
            iVar54 = (idx_t)psVar14[iVar56];
          }
          if (*(ushort *)(LStack_420._0_8_ + iVar54 * 2) <
              *(ushort *)(LStack_490._0_8_ + iVar48 * 2)) {
            oVar29.ptr = true_sel.ptr;
            iVar48 = iVar34;
            iVar34 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar48 = iVar34 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar34] = (sel_t)iVar49;
          iVar56 = iVar56 + 1;
          iVar34 = iVar48;
        } while (count != iVar56);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b411a6;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar32 = 0;
        uVar67 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              bVar69 = false;
              goto LAB_00b408d8;
            }
LAB_00b408f8:
            if (*(ushort *)(LStack_490._0_8_ + uVar59 * 2) <=
                *(ushort *)(LStack_420._0_8_ + uVar58 * 2)) {
LAB_00b4090c:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
              lVar32 = lVar32 + 1;
            }
          }
          else {
            uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                     *(ulong *)((long)LStack_490.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + (uVar59 >> 6) * 8);
            bVar69 = uVar57 == 0;
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
LAB_00b408d8:
              uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                       (ulong)(&(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
              if ((!bVar69) && (uVar57 != 0)) goto LAB_00b408f8;
              if (uVar57 != 0) goto LAB_00b4091b;
              goto LAB_00b4090c;
            }
            if (uVar57 != 0) goto LAB_00b408f8;
          }
LAB_00b4091b:
          uVar67 = uVar67 + 1;
        } while (count != uVar67);
        goto LAB_00b411a9;
      }
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      uVar67 = 0;
      local_4d0 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b3b1f4;
          }
LAB_00b3b214:
          if (*(ushort *)(LStack_420._0_8_ + uVar58 * 2) <
              *(ushort *)(LStack_490._0_8_ + uVar59 * 2)) {
LAB_00b3b232:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + 1;
          }
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (uVar57 != 0) goto LAB_00b3b214;
            goto LAB_00b3b232;
          }
LAB_00b3b1f4:
          uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                   (ulong)(&(LStack_420.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
          if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3b214;
          if (uVar57 != 0) goto LAB_00b3b232;
        }
        uVar67 = uVar67 + 1;
      } while (count != uVar67);
    }
    else {
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      iVar34 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b38b50;
          }
LAB_00b38b70:
          if (*(ushort *)(LStack_420._0_8_ + uVar58 * 2) <
              *(ushort *)(LStack_490._0_8_ + uVar59 * 2)) goto LAB_00b38b96;
LAB_00b38b84:
          iVar49 = iVar34 + 1;
          iVar56 = iVar34;
          oVar29.ptr = false_sel.ptr;
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
LAB_00b38b50:
            uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
            if ((!bVar69) && (uVar57 != 0)) goto LAB_00b38b70;
            if (uVar57 != 0) goto LAB_00b38b96;
            goto LAB_00b38b84;
          }
          if (uVar57 != 0) goto LAB_00b38b70;
LAB_00b38b96:
          iVar56 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
          iVar49 = iVar34;
        }
        (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
        uVar67 = uVar67 + 1;
        iVar34 = iVar49;
      } while (count != uVar67);
    }
    break;
  case INT16:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar11 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar12 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *(short *)(pdVar11 + uVar67 * 2) < *(short *)(pdVar9 + uVar67 * 2);
              bVar65 = *(short *)(pdVar9 + uVar67 * 2) <= *(short *)(pdVar11 + uVar67 * 2);
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              bVar68 = *(short *)(pdVar11 + uVar67 * 2) < *(short *)(pdVar9 + uVar67 * 2);
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = *(short *)(pdVar9 + uVar67 * 2) <= *(short *)(pdVar11 + uVar67 * 2);
            }
            psVar14[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4265e;
        }
        goto LAB_00b4265c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        psVar5 = (short *)right->data;
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *(short *)(pdVar9 + uVar67 * 2) <= *psVar5;
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *psVar5 < *(short *)(pdVar9 + uVar67 * 2);
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *psVar5 < *(short *)(pdVar9 + uVar67 * 2);
              bVar65 = *(short *)(pdVar9 + uVar67 * 2) <= *psVar5;
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar5 = (short *)left->data;
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *psVar5 <= *(short *)(pdVar9 + uVar67 * 2);
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *(short *)(pdVar9 + uVar67 * 2) < *psVar5;
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *(short *)(pdVar9 + uVar67 * 2) < *psVar5;
              bVar65 = *psVar5 <= *(short *)(pdVar9 + uVar67 * 2);
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (ulong *)0x0) {
          if (puVar43 != (ulong *)0x0) {
            bVar69 = false;
            goto LAB_00b415cf;
          }
        }
        else {
          uVar67 = *puVar2;
          bVar69 = (uVar67 & 1) == 0;
          if (puVar43 == (ulong *)0x0) {
            if ((uVar67 & 1) == 0) goto LAB_00b415e3;
          }
          else {
LAB_00b415cf:
            if ((*puVar43 & 1) == 0 || bVar69) {
              if ((*puVar43 & 1) != 0) goto LAB_00b415e3;
              goto LAB_00b4162f;
            }
          }
        }
        if (*(short *)right->data < *(short *)left->data) {
LAB_00b415e3:
          if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
LAB_00b4162f:
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          psVar14[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b410ab;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          iVar34 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            if (*(short *)(LStack_490._0_8_ + iVar49 * 2) <=
                *(short *)(LStack_420._0_8_ + iVar48 * 2)) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
              lVar32 = lVar32 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          goto LAB_00b410ad;
        }
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        iVar34 = 0;
        do {
          iVar56 = iVar34;
          if (psVar13 != (sel_t *)0x0) {
            iVar56 = (idx_t)psVar13[iVar34];
          }
          iVar49 = iVar34;
          if (lVar46 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
          }
          iVar48 = iVar34;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar34];
          }
          if (*(short *)(LStack_420._0_8_ + iVar48 * 2) < *(short *)(LStack_490._0_8_ + iVar49 * 2))
          {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
            local_4d0 = local_4d0 + 1;
          }
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
      else {
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        iVar56 = 0;
        iVar34 = 0;
        do {
          iVar49 = iVar56;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar56];
          }
          iVar48 = iVar56;
          if (lVar46 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar46 + iVar56 * 4);
          }
          iVar54 = iVar56;
          if (psVar14 != (sel_t *)0x0) {
            iVar54 = (idx_t)psVar14[iVar56];
          }
          if (*(short *)(LStack_420._0_8_ + iVar54 * 2) < *(short *)(LStack_490._0_8_ + iVar48 * 2))
          {
            oVar29.ptr = true_sel.ptr;
            iVar48 = iVar34;
            iVar34 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar48 = iVar34 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar34] = (sel_t)iVar49;
          iVar56 = iVar56 + 1;
          iVar34 = iVar48;
        } while (count != iVar56);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b411a6;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar32 = 0;
        uVar67 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              bVar69 = false;
              goto LAB_00b40793;
            }
LAB_00b407b3:
            if (*(short *)(LStack_490._0_8_ + uVar59 * 2) <=
                *(short *)(LStack_420._0_8_ + uVar58 * 2)) {
LAB_00b407c7:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
              lVar32 = lVar32 + 1;
            }
          }
          else {
            uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                     *(ulong *)((long)LStack_490.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + (uVar59 >> 6) * 8);
            bVar69 = uVar57 == 0;
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
LAB_00b40793:
              uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                       (ulong)(&(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
              if ((!bVar69) && (uVar57 != 0)) goto LAB_00b407b3;
              if (uVar57 != 0) goto LAB_00b407d6;
              goto LAB_00b407c7;
            }
            if (uVar57 != 0) goto LAB_00b407b3;
          }
LAB_00b407d6:
          uVar67 = uVar67 + 1;
        } while (count != uVar67);
        goto LAB_00b411a9;
      }
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b3b091;
          }
LAB_00b3b0b1:
          if (*(short *)(LStack_420._0_8_ + uVar58 * 2) < *(short *)(LStack_490._0_8_ + uVar59 * 2))
          {
LAB_00b3b0cf:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + 1;
          }
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (uVar57 != 0) goto LAB_00b3b0b1;
            goto LAB_00b3b0cf;
          }
LAB_00b3b091:
          uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                   (ulong)(&(LStack_420.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
          if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3b0b1;
          if (uVar57 != 0) goto LAB_00b3b0cf;
        }
        uVar67 = uVar67 + 1;
      } while (count != uVar67);
    }
    else {
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      iVar34 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b38a60;
          }
LAB_00b38a80:
          if (*(short *)(LStack_420._0_8_ + uVar58 * 2) < *(short *)(LStack_490._0_8_ + uVar59 * 2))
          goto LAB_00b38aa6;
LAB_00b38a94:
          iVar49 = iVar34 + 1;
          iVar56 = iVar34;
          oVar29.ptr = false_sel.ptr;
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
LAB_00b38a60:
            uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
            if ((!bVar69) && (uVar57 != 0)) goto LAB_00b38a80;
            if (uVar57 != 0) goto LAB_00b38aa6;
            goto LAB_00b38a94;
          }
          if (uVar57 != 0) goto LAB_00b38a80;
LAB_00b38aa6:
          iVar56 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
          iVar49 = iVar34;
        }
        (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
        uVar67 = uVar67 + 1;
        iVar34 = iVar49;
      } while (count != uVar67);
    }
    break;
  case UINT32:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar11 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar12 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          iVar34 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *(uint *)(pdVar11 + uVar67 * 4) < *(uint *)(pdVar9 + uVar67 * 4);
              bVar65 = *(uint *)(pdVar9 + uVar67 * 4) <= *(uint *)(pdVar11 + uVar67 * 4);
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          uVar67 = 0;
          iVar34 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              bVar68 = *(uint *)(pdVar11 + uVar67 * 4) < *(uint *)(pdVar9 + uVar67 * 4);
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = *(uint *)(pdVar9 + uVar67 * 4) <= *(uint *)(pdVar11 + uVar67 * 4);
            }
            psVar14[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4265e;
        }
        goto LAB_00b4265c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar4 = (uint *)right->data;
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *(uint *)(pdVar9 + uVar67 * 4) <= *puVar4;
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *puVar4 < *(uint *)(pdVar9 + uVar67 * 4);
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *puVar4 < *(uint *)(pdVar9 + uVar67 * 4);
              bVar65 = *(uint *)(pdVar9 + uVar67 * 4) <= *puVar4;
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        puVar4 = (uint *)left->data;
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *puVar4 <= *(uint *)(pdVar9 + uVar67 * 4);
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *(uint *)(pdVar9 + uVar67 * 4) < *puVar4;
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *(uint *)(pdVar9 + uVar67 * 4) < *puVar4;
              bVar65 = *puVar4 <= *(uint *)(pdVar9 + uVar67 * 4);
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (ulong *)0x0) {
          if (puVar43 != (ulong *)0x0) {
            bVar69 = false;
            goto LAB_00b41525;
          }
        }
        else {
          uVar67 = *puVar2;
          bVar69 = (uVar67 & 1) == 0;
          if (puVar43 == (ulong *)0x0) {
            if ((uVar67 & 1) == 0) goto LAB_00b41539;
          }
          else {
LAB_00b41525:
            if ((*puVar43 & 1) == 0 || bVar69) {
              if ((*puVar43 & 1) != 0) goto LAB_00b41539;
              goto LAB_00b41583;
            }
          }
        }
        if (*(uint *)right->data < *(uint *)left->data) {
LAB_00b41539:
          if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
LAB_00b41583:
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          psVar14[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b410ab;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          iVar34 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            if (*(uint *)(LStack_490._0_8_ + iVar49 * 4) <= *(uint *)(LStack_420._0_8_ + iVar48 * 4)
               ) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
              lVar32 = lVar32 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          goto LAB_00b410ad;
        }
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar34 = 0;
        local_4d0 = 0;
        do {
          iVar56 = iVar34;
          if (psVar13 != (sel_t *)0x0) {
            iVar56 = (idx_t)psVar13[iVar34];
          }
          iVar49 = iVar34;
          if (lVar46 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
          }
          iVar48 = iVar34;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar34];
          }
          if (*(uint *)(LStack_420._0_8_ + iVar48 * 4) < *(uint *)(LStack_490._0_8_ + iVar49 * 4)) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
            local_4d0 = local_4d0 + 1;
          }
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
      else {
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        iVar56 = 0;
        iVar34 = 0;
        do {
          iVar49 = iVar56;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar56];
          }
          iVar48 = iVar56;
          if (lVar46 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar46 + iVar56 * 4);
          }
          iVar54 = iVar56;
          if (psVar14 != (sel_t *)0x0) {
            iVar54 = (idx_t)psVar14[iVar56];
          }
          if (*(uint *)(LStack_420._0_8_ + iVar54 * 4) < *(uint *)(LStack_490._0_8_ + iVar48 * 4)) {
            oVar29.ptr = true_sel.ptr;
            iVar48 = iVar34;
            iVar34 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar48 = iVar34 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar34] = (sel_t)iVar49;
          iVar56 = iVar56 + 1;
          iVar34 = iVar48;
        } while (count != iVar56);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b411a6;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar32 = 0;
        uVar67 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              bVar69 = false;
              goto LAB_00b40650;
            }
LAB_00b40670:
            if (*(uint *)(LStack_490._0_8_ + uVar59 * 4) <= *(uint *)(LStack_420._0_8_ + uVar58 * 4)
               ) {
LAB_00b40682:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
              lVar32 = lVar32 + 1;
            }
          }
          else {
            uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                     *(ulong *)((long)LStack_490.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + (uVar59 >> 6) * 8);
            bVar69 = uVar57 == 0;
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
LAB_00b40650:
              uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                       (ulong)(&(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
              if ((!bVar69) && (uVar57 != 0)) goto LAB_00b40670;
              if (uVar57 != 0) goto LAB_00b40691;
              goto LAB_00b40682;
            }
            if (uVar57 != 0) goto LAB_00b40670;
          }
LAB_00b40691:
          uVar67 = uVar67 + 1;
        } while (count != uVar67);
        goto LAB_00b411a9;
      }
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      uVar67 = 0;
      local_4d0 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b3af30;
          }
LAB_00b3af50:
          if (*(uint *)(LStack_420._0_8_ + uVar58 * 4) < *(uint *)(LStack_490._0_8_ + uVar59 * 4)) {
LAB_00b3af6c:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + 1;
          }
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (uVar57 != 0) goto LAB_00b3af50;
            goto LAB_00b3af6c;
          }
LAB_00b3af30:
          uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                   (ulong)(&(LStack_420.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
          if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3af50;
          if (uVar57 != 0) goto LAB_00b3af6c;
        }
        uVar67 = uVar67 + 1;
      } while (count != uVar67);
    }
    else {
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      iVar34 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b38972;
          }
LAB_00b38992:
          if (*(uint *)(LStack_420._0_8_ + uVar58 * 4) < *(uint *)(LStack_490._0_8_ + uVar59 * 4))
          goto LAB_00b389b6;
LAB_00b389a4:
          iVar49 = iVar34 + 1;
          iVar56 = iVar34;
          oVar29.ptr = false_sel.ptr;
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
LAB_00b38972:
            uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
            if ((!bVar69) && (uVar57 != 0)) goto LAB_00b38992;
            if (uVar57 != 0) goto LAB_00b389b6;
            goto LAB_00b389a4;
          }
          if (uVar57 != 0) goto LAB_00b38992;
LAB_00b389b6:
          iVar56 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
          iVar49 = iVar34;
        }
        (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
        uVar67 = uVar67 + 1;
        iVar34 = iVar49;
      } while (count != uVar67);
    }
    break;
  case INT32:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar11 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar12 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *(int *)(pdVar11 + uVar67 * 4) < *(int *)(pdVar9 + uVar67 * 4);
              bVar65 = *(int *)(pdVar9 + uVar67 * 4) <= *(int *)(pdVar11 + uVar67 * 4);
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              bVar68 = *(int *)(pdVar11 + uVar67 * 4) < *(int *)(pdVar9 + uVar67 * 4);
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = *(int *)(pdVar9 + uVar67 * 4) <= *(int *)(pdVar11 + uVar67 * 4);
            }
            psVar14[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4265e;
        }
        goto LAB_00b4265c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar45 = (int *)right->data;
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *(int *)(pdVar9 + uVar67 * 4) <= *piVar45;
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *piVar45 < *(int *)(pdVar9 + uVar67 * 4);
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *piVar45 < *(int *)(pdVar9 + uVar67 * 4);
              bVar65 = *(int *)(pdVar9 + uVar67 * 4) <= *piVar45;
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar45 = (int *)left->data;
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *piVar45 <= *(int *)(pdVar9 + uVar67 * 4);
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *(int *)(pdVar9 + uVar67 * 4) < *piVar45;
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *(int *)(pdVar9 + uVar67 * 4) < *piVar45;
              bVar65 = *piVar45 <= *(int *)(pdVar9 + uVar67 * 4);
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (ulong *)0x0) {
          if (puVar43 != (ulong *)0x0) {
            bVar69 = false;
            goto LAB_00b4147b;
          }
        }
        else {
          uVar67 = *puVar2;
          bVar69 = (uVar67 & 1) == 0;
          if (puVar43 == (ulong *)0x0) {
            if ((uVar67 & 1) == 0) goto LAB_00b4148f;
          }
          else {
LAB_00b4147b:
            if ((*puVar43 & 1) == 0 || bVar69) {
              if ((*puVar43 & 1) != 0) goto LAB_00b4148f;
              goto LAB_00b414d9;
            }
          }
        }
        if (*(int *)right->data < *(int *)left->data) {
LAB_00b4148f:
          if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
LAB_00b414d9:
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          psVar14[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b410ab;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          iVar34 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            if (*(int *)(LStack_490._0_8_ + iVar49 * 4) <= *(int *)(LStack_420._0_8_ + iVar48 * 4))
            {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
              lVar32 = lVar32 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          goto LAB_00b410ad;
        }
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        iVar34 = 0;
        do {
          iVar56 = iVar34;
          if (psVar13 != (sel_t *)0x0) {
            iVar56 = (idx_t)psVar13[iVar34];
          }
          iVar49 = iVar34;
          if (lVar46 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
          }
          iVar48 = iVar34;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar34];
          }
          if (*(int *)(LStack_420._0_8_ + iVar48 * 4) < *(int *)(LStack_490._0_8_ + iVar49 * 4)) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
            local_4d0 = local_4d0 + 1;
          }
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
      else {
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        iVar56 = 0;
        iVar34 = 0;
        do {
          iVar49 = iVar56;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar56];
          }
          iVar48 = iVar56;
          if (lVar46 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar46 + iVar56 * 4);
          }
          iVar54 = iVar56;
          if (psVar14 != (sel_t *)0x0) {
            iVar54 = (idx_t)psVar14[iVar56];
          }
          if (*(int *)(LStack_420._0_8_ + iVar54 * 4) < *(int *)(LStack_490._0_8_ + iVar48 * 4)) {
            oVar29.ptr = true_sel.ptr;
            iVar48 = iVar34;
            iVar34 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar48 = iVar34 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar34] = (sel_t)iVar49;
          iVar56 = iVar56 + 1;
          iVar34 = iVar48;
        } while (count != iVar56);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b411a6;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar32 = 0;
        uVar67 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              bVar69 = false;
              goto LAB_00b4050f;
            }
LAB_00b4052f:
            if (*(int *)(LStack_490._0_8_ + uVar59 * 4) <= *(int *)(LStack_420._0_8_ + uVar58 * 4))
            {
LAB_00b40541:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
              lVar32 = lVar32 + 1;
            }
          }
          else {
            uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                     *(ulong *)((long)LStack_490.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + (uVar59 >> 6) * 8);
            bVar69 = uVar57 == 0;
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
LAB_00b4050f:
              uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                       (ulong)(&(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
              if ((!bVar69) && (uVar57 != 0)) goto LAB_00b4052f;
              if (uVar57 != 0) goto LAB_00b40550;
              goto LAB_00b40541;
            }
            if (uVar57 != 0) goto LAB_00b4052f;
          }
LAB_00b40550:
          uVar67 = uVar67 + 1;
        } while (count != uVar67);
        goto LAB_00b411a9;
      }
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b3add1;
          }
LAB_00b3adf1:
          if (*(int *)(LStack_420._0_8_ + uVar58 * 4) < *(int *)(LStack_490._0_8_ + uVar59 * 4)) {
LAB_00b3ae0d:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + 1;
          }
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (uVar57 != 0) goto LAB_00b3adf1;
            goto LAB_00b3ae0d;
          }
LAB_00b3add1:
          uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                   (ulong)(&(LStack_420.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
          if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3adf1;
          if (uVar57 != 0) goto LAB_00b3ae0d;
        }
        uVar67 = uVar67 + 1;
      } while (count != uVar67);
    }
    else {
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      iVar34 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b38884;
          }
LAB_00b388a4:
          if (*(int *)(LStack_420._0_8_ + uVar58 * 4) < *(int *)(LStack_490._0_8_ + uVar59 * 4))
          goto LAB_00b388c8;
LAB_00b388b6:
          iVar49 = iVar34 + 1;
          iVar56 = iVar34;
          oVar29.ptr = false_sel.ptr;
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
LAB_00b38884:
            uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
            if ((!bVar69) && (uVar57 != 0)) goto LAB_00b388a4;
            if (uVar57 != 0) goto LAB_00b388c8;
            goto LAB_00b388b6;
          }
          if (uVar57 != 0) goto LAB_00b388a4;
LAB_00b388c8:
          iVar56 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
          iVar49 = iVar34;
        }
        (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
        uVar67 = uVar67 + 1;
        iVar34 = iVar49;
      } while (count != uVar67);
    }
    break;
  case UINT64:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar11 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar12 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          iVar34 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *(ulong *)(pdVar11 + uVar67 * 8) < *(ulong *)(pdVar9 + uVar67 * 8);
              bVar65 = *(ulong *)(pdVar9 + uVar67 * 8) <= *(ulong *)(pdVar11 + uVar67 * 8);
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          uVar67 = 0;
          iVar34 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              bVar68 = *(ulong *)(pdVar11 + uVar67 * 8) < *(ulong *)(pdVar9 + uVar67 * 8);
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = *(ulong *)(pdVar9 + uVar67 * 8) <= *(ulong *)(pdVar11 + uVar67 * 8);
            }
            psVar14[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4265e;
        }
        goto LAB_00b4265c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (ulong *)right->data;
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *(ulong *)(pdVar9 + uVar67 * 8) <= *puVar2;
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *puVar2 < *(ulong *)(pdVar9 + uVar67 * 8);
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *puVar2 < *(ulong *)(pdVar9 + uVar67 * 8);
              bVar65 = *(ulong *)(pdVar9 + uVar67 * 8) <= *puVar2;
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        puVar2 = (ulong *)left->data;
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *puVar2 <= *(ulong *)(pdVar9 + uVar67 * 8);
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *(ulong *)(pdVar9 + uVar67 * 8) < *puVar2;
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *(ulong *)(pdVar9 + uVar67 * 8) < *puVar2;
              bVar65 = *puVar2 <= *(ulong *)(pdVar9 + uVar67 * 8);
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (ulong *)0x0) {
          if (puVar43 != (ulong *)0x0) {
            bVar69 = false;
            goto LAB_00b4190f;
          }
        }
        else {
          uVar67 = *puVar2;
          bVar69 = (uVar67 & 1) == 0;
          if (puVar43 == (ulong *)0x0) {
            if ((uVar67 & 1) == 0) goto LAB_00b41923;
          }
          else {
LAB_00b4190f:
            if ((*puVar43 & 1) == 0 || bVar69) {
              if ((*puVar43 & 1) != 0) goto LAB_00b41923;
              goto LAB_00b4196f;
            }
          }
        }
        if (*(ulong *)right->data < *(ulong *)left->data) {
LAB_00b41923:
          if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
LAB_00b4196f:
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          psVar14[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        iVar56 = 0;
        iVar34 = 0;
        do {
          iVar49 = iVar56;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar56];
          }
          iVar48 = iVar56;
          if (lVar46 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar46 + iVar56 * 4);
          }
          iVar54 = iVar56;
          if (psVar14 != (sel_t *)0x0) {
            iVar54 = (idx_t)psVar14[iVar56];
          }
          if (*(ulong *)(LStack_420._0_8_ + iVar54 * 8) < *(ulong *)(LStack_490._0_8_ + iVar48 * 8))
          {
            oVar29.ptr = true_sel.ptr;
            iVar48 = iVar34;
            iVar34 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar48 = iVar34 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar34] = (sel_t)iVar49;
          iVar56 = iVar56 + 1;
          iVar34 = iVar48;
        } while (count != iVar56);
      }
      else {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar46 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            lVar32 = 0;
            iVar34 = 0;
            do {
              iVar56 = iVar34;
              if (psVar13 != (sel_t *)0x0) {
                iVar56 = (idx_t)psVar13[iVar34];
              }
              iVar49 = iVar34;
              if (lVar46 != 0) {
                iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar48 = iVar34;
              if (psVar14 != (sel_t *)0x0) {
                iVar48 = (idx_t)psVar14[iVar34];
              }
              if (*(ulong *)(LStack_490._0_8_ + iVar49 * 8) <=
                  *(ulong *)(LStack_420._0_8_ + iVar48 * 8)) {
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
                lVar32 = lVar32 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b410ad;
          }
LAB_00b410ab:
          lVar32 = 0;
          goto LAB_00b410ad;
        }
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar34 = 0;
        local_4d0 = 0;
        do {
          iVar56 = iVar34;
          if (psVar13 != (sel_t *)0x0) {
            iVar56 = (idx_t)psVar13[iVar34];
          }
          iVar49 = iVar34;
          if (lVar46 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
          }
          iVar48 = iVar34;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar34];
          }
          if (*(ulong *)(LStack_420._0_8_ + iVar48 * 8) < *(ulong *)(LStack_490._0_8_ + iVar49 * 8))
          {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
            local_4d0 = local_4d0 + 1;
          }
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
    }
    else if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      iVar34 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b38f7d;
          }
LAB_00b38f9d:
          if (*(ulong *)(LStack_420._0_8_ + uVar58 * 8) < *(ulong *)(LStack_490._0_8_ + uVar59 * 8))
          goto LAB_00b38fc3;
LAB_00b38fb1:
          iVar49 = iVar34 + 1;
          iVar56 = iVar34;
          oVar29.ptr = false_sel.ptr;
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
LAB_00b38f7d:
            uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
            if ((!bVar69) && (uVar57 != 0)) goto LAB_00b38f9d;
            if (uVar57 != 0) goto LAB_00b38fc3;
            goto LAB_00b38fb1;
          }
          if (uVar57 != 0) goto LAB_00b38f9d;
LAB_00b38fc3:
          iVar56 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
          iVar49 = iVar34;
        }
        (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
        uVar67 = uVar67 + 1;
        iVar34 = iVar49;
      } while (count != uVar67);
    }
    else {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            uVar59 = uVar67;
            if (lVar46 != 0) {
              uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
            }
            uVar58 = uVar67;
            if (psVar14 != (sel_t *)0x0) {
              uVar58 = (ulong)psVar14[uVar67];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                bVar69 = false;
                goto LAB_00b40ca2;
              }
LAB_00b40cc2:
              if (*(ulong *)(LStack_490._0_8_ + uVar59 * 8) <=
                  *(ulong *)(LStack_420._0_8_ + uVar58 * 8)) {
LAB_00b40cd6:
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
                lVar32 = lVar32 + 1;
              }
            }
            else {
              uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                       *(ulong *)((long)LStack_490.type_info_.internal.
                                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + (uVar59 >> 6) * 8);
              bVar69 = uVar57 == 0;
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
LAB_00b40ca2:
                uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                         (ulong)(&(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
                if ((!bVar69) && (uVar57 != 0)) goto LAB_00b40cc2;
                if (uVar57 != 0) goto LAB_00b40ce5;
                goto LAB_00b40cd6;
              }
              if (uVar57 != 0) goto LAB_00b40cc2;
            }
LAB_00b40ce5:
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b411a9;
        }
LAB_00b411a6:
        lVar32 = 0;
        goto LAB_00b411a9;
      }
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      uVar67 = 0;
      local_4d0 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b3b615;
          }
LAB_00b3b635:
          if (*(ulong *)(LStack_420._0_8_ + uVar58 * 8) < *(ulong *)(LStack_490._0_8_ + uVar59 * 8))
          {
LAB_00b3b653:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + 1;
          }
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (uVar57 != 0) goto LAB_00b3b635;
            goto LAB_00b3b653;
          }
LAB_00b3b615:
          uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                   (ulong)(&(LStack_420.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
          if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3b635;
          if (uVar57 != 0) goto LAB_00b3b653;
        }
        uVar67 = uVar67 + 1;
      } while (count != uVar67);
    }
    break;
  case INT64:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar11 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar12 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *(long *)(pdVar11 + uVar67 * 8) < *(long *)(pdVar9 + uVar67 * 8);
              bVar65 = *(long *)(pdVar9 + uVar67 * 8) <= *(long *)(pdVar11 + uVar67 * 8);
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              bVar68 = *(long *)(pdVar11 + uVar67 * 8) < *(long *)(pdVar9 + uVar67 * 8);
            }
            psVar14[iVar34] = (sel_t)uVar33;
            iVar34 = iVar34 + bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          return iVar34;
        }
        if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = *(long *)(pdVar9 + uVar67 * 8) <= *(long *)(pdVar11 + uVar67 * 8);
            }
            psVar14[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar68;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4265e;
        }
        goto LAB_00b4265c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        plVar42 = (long *)right->data;
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *(long *)(pdVar9 + uVar67 * 8) <= *plVar42;
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *plVar42 < *(long *)(pdVar9 + uVar67 * 8);
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *plVar42 < *(long *)(pdVar9 + uVar67 * 8);
              bVar65 = *(long *)(pdVar9 + uVar67 * 8) <= *plVar42;
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar42 = (long *)left->data;
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b4368c;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *plVar42 <= *(long *)(pdVar9 + uVar67 * 8);
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4368e;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4d0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = *(long *)(pdVar9 + uVar67 * 8) < *plVar42;
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
            goto LAB_00b4369b;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          local_4d0 = 0;
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = *(long *)(pdVar9 + uVar67 * 8) < *plVar42;
              bVar65 = *plVar42 <= *(long *)(pdVar9 + uVar67 * 8);
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b4369b;
        }
        goto LAB_00b3fddf;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (ulong *)0x0) {
          if (puVar43 != (ulong *)0x0) {
            bVar69 = false;
            goto LAB_00b41727;
          }
        }
        else {
          uVar67 = *puVar2;
          bVar69 = (uVar67 & 1) == 0;
          if (puVar43 == (ulong *)0x0) {
            if ((uVar67 & 1) == 0) goto LAB_00b4173b;
          }
          else {
LAB_00b41727:
            if ((*puVar43 & 1) == 0 || bVar69) {
              if ((*puVar43 & 1) != 0) goto LAB_00b4173b;
              goto LAB_00b41787;
            }
          }
        }
        if (*(long *)right->data < *(long *)left->data) {
LAB_00b4173b:
          if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
LAB_00b41787:
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          psVar14[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b410ab;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          iVar34 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            if (*(long *)(LStack_490._0_8_ + iVar49 * 8) <= *(long *)(LStack_420._0_8_ + iVar48 * 8)
               ) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar56;
              lVar32 = lVar32 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          goto LAB_00b410ad;
        }
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        iVar34 = 0;
        do {
          iVar56 = iVar34;
          if (psVar13 != (sel_t *)0x0) {
            iVar56 = (idx_t)psVar13[iVar34];
          }
          iVar49 = iVar34;
          if (lVar46 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
          }
          iVar48 = iVar34;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar34];
          }
          if (*(long *)(LStack_420._0_8_ + iVar48 * 8) < *(long *)(LStack_490._0_8_ + iVar49 * 8)) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
            local_4d0 = local_4d0 + 1;
          }
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
      else {
        if (count == 0) goto LAB_00b3bb5a;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        iVar56 = 0;
        iVar34 = 0;
        do {
          iVar49 = iVar56;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar56];
          }
          iVar48 = iVar56;
          if (lVar46 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar46 + iVar56 * 4);
          }
          iVar54 = iVar56;
          if (psVar14 != (sel_t *)0x0) {
            iVar54 = (idx_t)psVar14[iVar56];
          }
          if (*(long *)(LStack_420._0_8_ + iVar54 * 8) < *(long *)(LStack_490._0_8_ + iVar48 * 8)) {
            oVar29.ptr = true_sel.ptr;
            iVar48 = iVar34;
            iVar34 = local_4d0;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar48 = iVar34 + 1;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar34] = (sel_t)iVar49;
          iVar56 = iVar56 + 1;
          iVar34 = iVar48;
        } while (count != iVar56);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b411a6;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar32 = 0;
        uVar67 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              bVar69 = false;
              goto LAB_00b40a1c;
            }
LAB_00b40a3c:
            if (*(long *)(LStack_490._0_8_ + uVar59 * 8) <= *(long *)(LStack_420._0_8_ + uVar58 * 8)
               ) {
LAB_00b40a50:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
              lVar32 = lVar32 + 1;
            }
          }
          else {
            uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                     *(ulong *)((long)LStack_490.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + (uVar59 >> 6) * 8);
            bVar69 = uVar57 == 0;
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
LAB_00b40a1c:
              uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                       (ulong)(&(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
              if ((!bVar69) && (uVar57 != 0)) goto LAB_00b40a3c;
              if (uVar57 != 0) goto LAB_00b40a5f;
              goto LAB_00b40a50;
            }
            if (uVar57 != 0) goto LAB_00b40a3c;
          }
LAB_00b40a5f:
          uVar67 = uVar67 + 1;
        } while (count != uVar67);
        goto LAB_00b411a9;
      }
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b3b355;
          }
LAB_00b3b375:
          if (*(long *)(LStack_420._0_8_ + uVar58 * 8) < *(long *)(LStack_490._0_8_ + uVar59 * 8)) {
LAB_00b3b393:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + 1;
          }
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (uVar57 != 0) goto LAB_00b3b375;
            goto LAB_00b3b393;
          }
LAB_00b3b355:
          uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                   (ulong)(&(LStack_420.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
          if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3b375;
          if (uVar57 != 0) goto LAB_00b3b393;
        }
        uVar67 = uVar67 + 1;
      } while (count != uVar67);
    }
    else {
      if (count == 0) goto LAB_00b3bb5a;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      iVar34 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b38c40;
          }
LAB_00b38c60:
          if (*(long *)(LStack_420._0_8_ + uVar58 * 8) < *(long *)(LStack_490._0_8_ + uVar59 * 8))
          goto LAB_00b38c86;
LAB_00b38c74:
          iVar49 = iVar34 + 1;
          iVar56 = iVar34;
          oVar29.ptr = false_sel.ptr;
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
LAB_00b38c40:
            uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
            if ((!bVar69) && (uVar57 != 0)) goto LAB_00b38c60;
            if (uVar57 != 0) goto LAB_00b38c86;
            goto LAB_00b38c74;
          }
          if (uVar57 != 0) goto LAB_00b38c60;
LAB_00b38c86:
          iVar56 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
          iVar49 = iVar34;
        }
        (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
        uVar67 = uVar67 + 1;
        iVar34 = iVar49;
      } while (count != uVar67);
    }
    break;
  default:
switchD_00b341be_caseD_a:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_498 = (undefined1  [8])&LStack_490.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,"Invalid type for distinct selection","");
    InternalException::InternalException(this_02,(string *)local_498);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar38 = (float *)left->data;
        pfVar61 = (float *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar61);
              bVar65 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
            pfVar38 = pfVar38 + 1;
            pfVar61 = pfVar61 + 1;
          } while (count != uVar67);
          return local_4d0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          uVar67 = 0;
          local_4d0 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar61);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            uVar67 = uVar67 + 1;
            pfVar38 = pfVar38 + 1;
            pfVar61 = pfVar61 + 1;
          } while (count != uVar67);
          return local_4d0;
        }
        if (count != 0) {
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar61);
              bVar68 = !bVar68;
            }
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar68;
            uVar67 = uVar67 + 1;
            pfVar38 = pfVar38 + 1;
            pfVar61 = pfVar61 + 1;
          } while (count != uVar67);
          goto LAB_00b4259b;
        }
LAB_00b42598:
        lVar46 = 0;
LAB_00b4259b:
        return count - lVar46;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pfVar38 = (float *)right->data;
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pfVar61 = (float *)left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_00b434b0:
              lVar46 = 0;
            }
            else {
              lVar46 = 0;
              uVar67 = 0;
              do {
                uVar33 = uVar67;
                if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                    (sel_t *)0x0) {
                  uVar33 = (ulong)(*(sel_t **)
                                    &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                  [uVar67];
                }
                puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar68 = false;
                }
                else {
                  bVar68 = (*(byte *)local_498 & 1) == 0;
                }
                if (!bVar69 && bVar68 == false) {
                  bVar68 = GreaterThan::Operation<float>(pfVar61,pfVar38);
                  bVar68 = !bVar68;
                }
                (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)bVar68;
                uVar67 = uVar67 + 1;
                pfVar61 = pfVar61 + 1;
              } while (count != uVar67);
            }
LAB_00b434b3:
            local_4d0 = count - lVar46;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_00b43709;
          }
          if (count != 0) {
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar67];
              }
              puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<float>(pfVar61,pfVar38);
              }
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
              pfVar61 = pfVar61 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar67);
            goto LAB_00b43709;
          }
        }
        else if (count != 0) {
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = GreaterThan::Operation<float>(pfVar61,pfVar38);
              bVar65 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
            pfVar61 = pfVar61 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar67);
          goto LAB_00b43709;
        }
        goto LAB_00b3fc75;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar38 = (float *)left->data;
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pfVar61 = (float *)right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_00b43544:
              lVar46 = 0;
            }
            else {
              lVar46 = 0;
              uVar67 = 0;
              do {
                uVar33 = uVar67;
                if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                    (sel_t *)0x0) {
                  uVar33 = (ulong)(*(sel_t **)
                                    &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                  [uVar67];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (*(byte *)local_498 & 1) == 0;
                }
                puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar68 = false;
                }
                else {
                  bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                }
                if (!bVar69 && bVar68 == false) {
                  bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar61);
                  bVar68 = !bVar68;
                }
                (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)bVar68;
                uVar67 = uVar67 + 1;
                pfVar61 = pfVar61 + 1;
              } while (count != uVar67);
            }
LAB_00b43547:
            local_4d0 = count - lVar46;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_00b43709;
          }
          if (count != 0) {
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar61);
              }
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
              pfVar61 = pfVar61 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar67);
            goto LAB_00b43709;
          }
        }
        else if (count != 0) {
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar61);
              bVar65 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
            pfVar61 = pfVar61 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar67);
          goto LAB_00b43709;
        }
        goto LAB_00b3fc75;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (ulong *)0x0) {
          if (puVar43 != (ulong *)0x0) {
            bVar69 = false;
            goto LAB_00b411f8;
          }
        }
        else {
          uVar67 = *puVar2;
          bVar69 = (uVar67 & 1) == 0;
          if (puVar43 == (ulong *)0x0) {
            if ((uVar67 & 1) == 0) goto LAB_00b41208;
          }
          else {
LAB_00b411f8:
            if ((*puVar43 & 1) == 0 || bVar69) {
              if ((*puVar43 & 1) != 0) goto LAB_00b41208;
              goto LAB_00b41255;
            }
          }
        }
        bVar69 = GreaterThan::Operation<float>((float *)left->data,(float *)right->data);
        if (bVar69) {
LAB_00b41208:
          if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
LAB_00b41255:
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          psVar14[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    uVar17 = LStack_490._0_8_;
    uVar20 = LStack_420._0_8_;
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
LAB_00b40fca:
            lVar32 = 0;
          }
          else {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar46 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            lVar32 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              uVar59 = uVar67;
              if (lVar46 != 0) {
                uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
              }
              uVar58 = uVar67;
              if (psVar14 != (sel_t *)0x0) {
                uVar58 = (ulong)psVar14[uVar67];
              }
              bVar69 = GreaterThan::Operation<float>
                                 ((float *)(uVar17 + uVar59 * 4),(float *)(uVar20 + uVar58 * 4));
              if (!bVar69) {
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
                lVar32 = lVar32 + 1;
              }
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
          }
LAB_00b40fcc:
          local_4d0 = count - lVar32;
        }
        else {
          if (count == 0) goto LAB_00b3b9a8;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          uVar67 = 0;
          local_4d0 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            uVar59 = uVar67;
            if (lVar46 != 0) {
              uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
            }
            uVar58 = uVar67;
            if (psVar14 != (sel_t *)0x0) {
              uVar58 = (ulong)psVar14[uVar67];
            }
            bVar69 = GreaterThan::Operation<float>
                               ((float *)(uVar17 + uVar59 * 4),(float *)(uVar20 + uVar58 * 4));
            if (bVar69) {
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + 1;
            }
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
        }
      }
      else if (count == 0) {
LAB_00b3b9a8:
        local_4d0 = 0;
      }
      else {
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        uVar67 = 0;
        iVar34 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          bVar69 = GreaterThan::Operation<float>
                             ((float *)(uVar17 + uVar59 * 4),(float *)(uVar20 + uVar58 * 4));
          if (bVar69) {
            iVar56 = local_4d0;
            oVar29.ptr = true_sel.ptr;
            iVar49 = iVar34;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar49 = iVar34 + 1;
            iVar56 = iVar34;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
          uVar67 = uVar67 + 1;
          iVar34 = iVar49;
        } while (count != uVar67);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b40fca;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar32 = 0;
        uVar67 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              bVar69 = false;
              goto LAB_00b3feec;
            }
LAB_00b3ff0c:
            bVar69 = GreaterThan::Operation<float>
                               ((float *)(uVar17 + uVar59 * 4),(float *)(uVar20 + uVar58 * 4));
            if (!bVar69) {
LAB_00b3ff27:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
              lVar32 = lVar32 + 1;
            }
          }
          else {
            uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                     *(ulong *)((long)LStack_490.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + (uVar59 >> 6) * 8);
            bVar69 = uVar57 == 0;
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
LAB_00b3feec:
              uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                       (ulong)(&(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
              if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3ff0c;
              if (uVar57 != 0) goto LAB_00b3ff36;
              goto LAB_00b3ff27;
            }
            if (uVar57 != 0) goto LAB_00b3ff0c;
          }
LAB_00b3ff36:
          uVar67 = uVar67 + 1;
        } while (count != uVar67);
        goto LAB_00b40fcc;
      }
      if (count == 0) goto LAB_00b3b9a8;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      uVar67 = 0;
      local_4d0 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b3a752;
          }
LAB_00b3a772:
          bVar69 = GreaterThan::Operation<float>
                             ((float *)(uVar17 + uVar59 * 4),(float *)(uVar20 + uVar58 * 4));
          if (bVar69) {
LAB_00b3a78d:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + 1;
          }
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (uVar57 != 0) goto LAB_00b3a772;
            goto LAB_00b3a78d;
          }
LAB_00b3a752:
          uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                   (ulong)(&(LStack_420.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
          if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3a772;
          if (uVar57 != 0) goto LAB_00b3a78d;
        }
        uVar67 = uVar67 + 1;
      } while (count != uVar67);
    }
    else {
      if (count == 0) goto LAB_00b3b9a8;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      iVar34 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b3843f;
          }
LAB_00b3845f:
          bVar69 = GreaterThan::Operation<float>
                             ((float *)(uVar17 + uVar59 * 4),(float *)(uVar20 + uVar58 * 4));
          if (bVar69) goto LAB_00b3848c;
LAB_00b3847a:
          iVar49 = iVar34 + 1;
          iVar56 = iVar34;
          oVar29.ptr = false_sel.ptr;
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
LAB_00b3843f:
            uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
            if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3845f;
            if (uVar57 != 0) goto LAB_00b3848c;
            goto LAB_00b3847a;
          }
          if (uVar57 != 0) goto LAB_00b3845f;
LAB_00b3848c:
          iVar56 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          iVar49 = iVar34;
          local_4d0 = local_4d0 + 1;
        }
        (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
        uVar67 = uVar67 + 1;
        iVar34 = iVar49;
      } while (count != uVar67);
    }
    goto LAB_00b40fd9;
  case DOUBLE:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar39 = (double *)left->data;
        pdVar62 = (double *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar62);
              bVar65 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
            pdVar39 = pdVar39 + 1;
            pdVar62 = pdVar62 + 1;
          } while (count != uVar67);
          return local_4d0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          uVar67 = 0;
          local_4d0 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar62);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            uVar67 = uVar67 + 1;
            pdVar39 = pdVar39 + 1;
            pdVar62 = pdVar62 + 1;
          } while (count != uVar67);
          return local_4d0;
        }
        if (count != 0) {
          lVar46 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar62);
              bVar68 = !bVar68;
            }
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar68;
            uVar67 = uVar67 + 1;
            pdVar39 = pdVar39 + 1;
            pdVar62 = pdVar62 + 1;
          } while (count != uVar67);
          goto LAB_00b4259b;
        }
        goto LAB_00b42598;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar39 = (double *)right->data;
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar62 = (double *)left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b434b0;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar67];
              }
              puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = GreaterThan::Operation<double>(pdVar62,pdVar39);
                bVar68 = !bVar68;
              }
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
              pdVar62 = pdVar62 + 1;
            } while (count != uVar67);
            goto LAB_00b434b3;
          }
          if (count != 0) {
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar67];
              }
              puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<double>(pdVar62,pdVar39);
              }
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
              pdVar62 = pdVar62 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar67);
            goto LAB_00b43709;
          }
        }
        else if (count != 0) {
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = GreaterThan::Operation<double>(pdVar62,pdVar39);
              bVar65 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
            pdVar62 = pdVar62 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar67);
          goto LAB_00b43709;
        }
        goto LAB_00b3fc75;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar39 = (double *)left->data;
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar62 = (double *)right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b43544;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar62);
                bVar68 = !bVar68;
              }
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar68;
              uVar67 = uVar67 + 1;
              pdVar62 = pdVar62 + 1;
            } while (count != uVar67);
            goto LAB_00b43547;
          }
          if (count != 0) {
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar62);
              }
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
              pdVar62 = pdVar62 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar67);
            goto LAB_00b43709;
          }
        }
        else if (count != 0) {
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar67];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            bVar65 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar65 == false) {
              bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar62);
              bVar65 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar65;
            uVar67 = uVar67 + 1;
            pdVar62 = pdVar62 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar67);
          goto LAB_00b43709;
        }
        goto LAB_00b3fc75;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (ulong *)0x0) {
          if (puVar43 != (ulong *)0x0) {
            bVar69 = false;
            goto LAB_00b413cc;
          }
        }
        else {
          uVar67 = *puVar2;
          bVar69 = (uVar67 & 1) == 0;
          if (puVar43 == (ulong *)0x0) {
            if ((uVar67 & 1) == 0) goto LAB_00b413dc;
          }
          else {
LAB_00b413cc:
            if ((*puVar43 & 1) == 0 || bVar69) {
              if ((*puVar43 & 1) != 0) goto LAB_00b413dc;
              goto LAB_00b41429;
            }
          }
        }
        bVar69 = GreaterThan::Operation<double>((double *)left->data,(double *)right->data);
        if (bVar69) {
LAB_00b413dc:
          if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
LAB_00b41429:
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          psVar14[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    uVar17 = LStack_490._0_8_;
    uVar20 = LStack_420._0_8_;
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b40fca;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            uVar59 = uVar67;
            if (lVar46 != 0) {
              uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
            }
            uVar58 = uVar67;
            if (psVar14 != (sel_t *)0x0) {
              uVar58 = (ulong)psVar14[uVar67];
            }
            bVar69 = GreaterThan::Operation<double>
                               ((double *)(uVar17 + uVar59 * 8),(double *)(uVar20 + uVar58 * 8));
            if (!bVar69) {
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
              lVar32 = lVar32 + 1;
            }
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b40fcc;
        }
        if (count == 0) goto LAB_00b3b9a8;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        uVar67 = 0;
        local_4d0 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          bVar69 = GreaterThan::Operation<double>
                             ((double *)(uVar17 + uVar59 * 8),(double *)(uVar20 + uVar58 * 8));
          if (bVar69) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + 1;
          }
          uVar67 = uVar67 + 1;
        } while (count != uVar67);
      }
      else {
        if (count == 0) goto LAB_00b3b9a8;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4d0 = 0;
        uVar67 = 0;
        iVar34 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          uVar59 = uVar67;
          if (lVar46 != 0) {
            uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
          }
          uVar58 = uVar67;
          if (psVar14 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar14[uVar67];
          }
          bVar69 = GreaterThan::Operation<double>
                             ((double *)(uVar17 + uVar59 * 8),(double *)(uVar20 + uVar58 * 8));
          if (bVar69) {
            iVar56 = local_4d0;
            oVar29.ptr = true_sel.ptr;
            iVar49 = iVar34;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar49 = iVar34 + 1;
            iVar56 = iVar34;
            oVar29.ptr = false_sel.ptr;
          }
          (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
          uVar67 = uVar67 + 1;
          iVar34 = iVar49;
        } while (count != uVar67);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar32 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            uVar59 = uVar67;
            if (lVar46 != 0) {
              uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
            }
            uVar58 = uVar67;
            if (psVar14 != (sel_t *)0x0) {
              uVar58 = (ulong)psVar14[uVar67];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                bVar69 = false;
                goto LAB_00b403c5;
              }
LAB_00b403e5:
              bVar69 = GreaterThan::Operation<double>
                                 ((double *)(uVar17 + uVar59 * 8),(double *)(uVar20 + uVar58 * 8));
              if (!bVar69) {
LAB_00b40400:
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar33;
                lVar32 = lVar32 + 1;
              }
            }
            else {
              uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                       *(ulong *)((long)LStack_490.type_info_.internal.
                                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + (uVar59 >> 6) * 8);
              bVar69 = uVar57 == 0;
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
LAB_00b403c5:
                uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                         (ulong)(&(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
                if ((!bVar69) && (uVar57 != 0)) goto LAB_00b403e5;
                if (uVar57 != 0) goto LAB_00b4040f;
                goto LAB_00b40400;
              }
              if (uVar57 != 0) goto LAB_00b403e5;
            }
LAB_00b4040f:
            uVar67 = uVar67 + 1;
          } while (count != uVar67);
          goto LAB_00b40fcc;
        }
        goto LAB_00b40fca;
      }
      if (count == 0) goto LAB_00b3b9a8;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      uVar67 = 0;
      local_4d0 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b3ac65;
          }
LAB_00b3ac85:
          bVar69 = GreaterThan::Operation<double>
                             ((double *)(uVar17 + uVar59 * 8),(double *)(uVar20 + uVar58 * 8));
          if (bVar69) {
LAB_00b3aca0:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + 1;
          }
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (uVar57 != 0) goto LAB_00b3ac85;
            goto LAB_00b3aca0;
          }
LAB_00b3ac65:
          uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                   (ulong)(&(LStack_420.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
          if ((!bVar69) && (uVar57 != 0)) goto LAB_00b3ac85;
          if (uVar57 != 0) goto LAB_00b3aca0;
        }
        uVar67 = uVar67 + 1;
      } while (count != uVar67);
    }
    else {
      if (count == 0) goto LAB_00b3b9a8;
      psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
      lVar46 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4d0 = 0;
      uVar67 = 0;
      iVar34 = 0;
      do {
        uVar33 = uVar67;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar67];
        }
        uVar59 = uVar67;
        if (lVar46 != 0) {
          uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
        }
        uVar58 = uVar67;
        if (psVar14 != (sel_t *)0x0) {
          uVar58 = (ulong)psVar14[uVar67];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            bVar69 = false;
            goto LAB_00b38781;
          }
LAB_00b387a1:
          bVar69 = GreaterThan::Operation<double>
                             ((double *)(uVar17 + uVar59 * 8),(double *)(uVar20 + uVar58 * 8));
          if (bVar69) goto LAB_00b387ce;
LAB_00b387bc:
          iVar49 = iVar34 + 1;
          iVar56 = iVar34;
          oVar29.ptr = false_sel.ptr;
        }
        else {
          uVar57 = 1L << ((byte)uVar59 & 0x3f) &
                   *(ulong *)((long)LStack_490.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + (uVar59 >> 6) * 8);
          bVar69 = uVar57 == 0;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
LAB_00b38781:
            uVar57 = 1L << ((byte)uVar58 & 0x3f) &
                     (ulong)(&(LStack_420.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo)[uVar58 >> 6];
            if ((!bVar69) && (uVar57 != 0)) goto LAB_00b387a1;
            if (uVar57 != 0) goto LAB_00b387ce;
            goto LAB_00b387bc;
          }
          if (uVar57 != 0) goto LAB_00b387a1;
LAB_00b387ce:
          iVar56 = local_4d0;
          oVar29.ptr = true_sel.ptr;
          iVar49 = iVar34;
          local_4d0 = local_4d0 + 1;
        }
        (oVar29.ptr)->sel_vector[iVar56] = (sel_t)uVar33;
        uVar67 = uVar67 + 1;
        iVar34 = iVar49;
      } while (count != uVar67);
    }
    goto LAB_00b40fd9;
  case INTERVAL:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar11 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar12 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          lVar32 = 8;
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (puVar12 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              lVar52 = (long)*(int *)(pdVar9 + lVar32 + -4) +
                       *(long *)(pdVar9 + lVar32) / 86400000000;
              lVar60 = (long)*(int *)(pdVar9 + lVar32 + -8) + lVar52 / 0x1e;
              lVar47 = (long)*(int *)(pdVar11 + lVar32 + -4) +
                       *(long *)(pdVar11 + lVar32) / 86400000000;
              lVar66 = (long)*(int *)(pdVar11 + lVar32 + -8) + lVar47 / 0x1e;
              bVar68 = true;
              if (lVar60 <= lVar66) {
                if (lVar60 < lVar66) {
                  bVar68 = false;
                }
                else {
                  lVar52 = lVar52 % 0x1e;
                  lVar47 = lVar47 % 0x1e;
                  if (lVar52 <= lVar47) {
                    bVar68 = *(long *)(pdVar11 + lVar32) % 86400000000 <
                             *(long *)(pdVar9 + lVar32) % 86400000000 && lVar47 <= lVar52;
                  }
                }
              }
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar68 ^ 1);
            uVar67 = uVar67 + 1;
            lVar32 = lVar32 + 0x10;
          } while (count != uVar67);
          return local_4d0;
        }
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            lVar46 = 0;
          }
          else {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar32 = 8;
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (puVar12 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                lVar52 = (long)*(int *)(pdVar9 + lVar32 + -4) +
                         *(long *)(pdVar9 + lVar32) / 86400000000;
                lVar60 = (long)*(int *)(pdVar9 + lVar32 + -8) + lVar52 / 0x1e;
                lVar47 = (long)*(int *)(pdVar11 + lVar32 + -4) +
                         *(long *)(pdVar11 + lVar32) / 86400000000;
                lVar66 = (long)*(int *)(pdVar11 + lVar32 + -8) + lVar47 / 0x1e;
                bVar68 = true;
                if (lVar60 <= lVar66) {
                  if (lVar60 < lVar66) {
                    bVar68 = false;
                  }
                  else {
                    lVar52 = lVar52 % 0x1e;
                    lVar47 = lVar47 % 0x1e;
                    if (lVar52 <= lVar47) {
                      bVar68 = *(long *)(pdVar11 + lVar32) % 86400000000 <
                               *(long *)(pdVar9 + lVar32) % 86400000000 && lVar47 <= lVar52;
                    }
                  }
                }
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar68 ^ 1);
              uVar67 = uVar67 + 1;
              lVar32 = lVar32 + 0x10;
            } while (count != uVar67);
          }
          return count - lVar46;
        }
        if (count == 0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (true_sel.ptr)->sel_vector;
        lVar46 = 8;
        uVar67 = 0;
        local_4d0 = 0;
        do {
          uVar33 = uVar67;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar67];
          }
          if (puVar8 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
          }
          if (puVar12 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar12[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
          }
          if (!bVar69 && bVar68 == true) {
            lVar47 = (long)*(int *)(pdVar9 + lVar46 + -4) + *(long *)(pdVar9 + lVar46) / 86400000000
            ;
            lVar66 = (long)*(int *)(pdVar9 + lVar46 + -8) + lVar47 / 0x1e;
            lVar32 = (long)*(int *)(pdVar11 + lVar46 + -4) +
                     *(long *)(pdVar11 + lVar46) / 86400000000;
            lVar52 = (long)*(int *)(pdVar11 + lVar46 + -8) + lVar32 / 0x1e;
            bVar68 = true;
            if (lVar66 <= lVar52) {
              if (lVar66 < lVar52) {
                bVar68 = false;
              }
              else {
                lVar47 = lVar47 % 0x1e;
                lVar32 = lVar32 % 0x1e;
                if (lVar47 <= lVar32) {
                  bVar68 = *(long *)(pdVar11 + lVar46) % 86400000000 <
                           *(long *)(pdVar9 + lVar46) % 86400000000 && lVar32 <= lVar47;
                }
              }
            }
          }
          psVar14[local_4d0] = (sel_t)uVar33;
          local_4d0 = local_4d0 + bVar68;
          uVar67 = uVar67 + 1;
          lVar46 = lVar46 + 0x10;
        } while (count != uVar67);
        return local_4d0;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar45 = (int *)right->data;
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_478._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_00b436f4:
              lVar46 = 0;
            }
            else {
              psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              psVar14 = (false_sel.ptr)->sel_vector;
              plVar42 = (long *)(pdVar9 + 8);
              lVar46 = 0;
              uVar67 = 0;
              do {
                uVar33 = uVar67;
                if (psVar13 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar13[uVar67];
                }
                if (puVar8 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (bool)(*(byte *)local_498 & 1);
                }
                if (!bVar69 && bVar68 == true) {
                  lVar52 = (long)*(int *)((long)plVar42 + -4) + *plVar42 / 86400000000;
                  lVar47 = (long)(int)plVar42[-1] + lVar52 / 0x1e;
                  lVar32 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
                  lVar66 = (long)*piVar45 + lVar32 / 0x1e;
                  bVar68 = true;
                  if (lVar47 <= lVar66) {
                    if (lVar47 < lVar66) {
                      bVar68 = false;
                    }
                    else {
                      lVar52 = lVar52 % 0x1e;
                      lVar32 = lVar32 % 0x1e;
                      if (lVar52 <= lVar32) {
                        bVar68 = *(long *)(piVar45 + 2) % 86400000000 < *plVar42 % 86400000000 &&
                                 lVar32 <= lVar52;
                      }
                    }
                  }
                }
                psVar14[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)(bVar68 ^ 1);
                uVar67 = uVar67 + 1;
                plVar42 = plVar42 + 2;
              } while (count != uVar67);
            }
LAB_00b436f7:
            local_4d0 = count - lVar46;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_00b43709;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            plVar42 = (long *)(pdVar9 + 8);
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (!bVar69 && bVar68 == true) {
                lVar47 = (long)*(int *)((long)plVar42 + -4) + *plVar42 / 86400000000;
                lVar32 = (long)(int)plVar42[-1] + lVar47 / 0x1e;
                lVar46 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
                lVar52 = (long)*piVar45 + lVar46 / 0x1e;
                bVar68 = true;
                if (lVar32 <= lVar52) {
                  if (lVar32 < lVar52) {
                    bVar68 = false;
                  }
                  else {
                    lVar47 = lVar47 % 0x1e;
                    lVar46 = lVar46 % 0x1e;
                    if (lVar47 <= lVar46) {
                      bVar68 = *(long *)(piVar45 + 2) % 86400000000 < *plVar42 % 86400000000 &&
                               lVar46 <= lVar47;
                    }
                  }
                }
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
              plVar42 = plVar42 + 2;
            } while (count != uVar67);
            goto LAB_00b43709;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          local_3c0 = (element_type *)(true_sel.ptr)->sel_vector;
          psVar14 = (false_sel.ptr)->sel_vector;
          plVar42 = (long *)(pdVar9 + 8);
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            if (!bVar69 && bVar68 == true) {
              lVar52 = (long)*(int *)((long)plVar42 + -4) + *plVar42 / 86400000000;
              lVar47 = (long)(int)plVar42[-1] + lVar52 / 0x1e;
              lVar32 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
              lVar66 = (long)*piVar45 + lVar32 / 0x1e;
              bVar68 = true;
              if (lVar47 <= lVar66) {
                if (lVar47 < lVar66) {
                  bVar68 = false;
                }
                else {
                  lVar52 = lVar52 % 0x1e;
                  lVar32 = lVar32 % 0x1e;
                  if (lVar52 <= lVar32) {
                    bVar68 = *(long *)(piVar45 + 2) % 86400000000 < *plVar42 % 86400000000 &&
                             lVar32 <= lVar52;
                  }
                }
              }
            }
            *(sel_t *)((long)&local_3c0->_vptr_ExtraTypeInfo + local_4d0 * 4) = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar14[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar68 ^ 1);
            uVar67 = uVar67 + 1;
            plVar42 = plVar42 + 2;
          } while (count != uVar67);
          goto LAB_00b43709;
        }
LAB_00b3fc75:
        local_4d0 = 0;
        local_478._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        goto LAB_00b43709;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar45 = (int *)left->data;
        puVar8 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar8 != (unsigned_long *)0x0) && ((*puVar8 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar8 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_478._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b436f4;
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (false_sel.ptr)->sel_vector;
            plVar42 = (long *)(pdVar9 + 8);
            lVar46 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                lVar47 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
                lVar66 = (long)*piVar45 + lVar47 / 0x1e;
                lVar32 = (long)*(int *)((long)plVar42 + -4) + *plVar42 / 86400000000;
                lVar52 = (long)(int)plVar42[-1] + lVar32 / 0x1e;
                bVar68 = true;
                if (lVar66 <= lVar52) {
                  if (lVar66 < lVar52) {
                    bVar68 = false;
                  }
                  else {
                    lVar47 = lVar47 % 0x1e;
                    lVar32 = lVar32 % 0x1e;
                    if (lVar47 <= lVar32) {
                      bVar68 = *plVar42 % 86400000000 < *(long *)(piVar45 + 2) % 86400000000 &&
                               lVar32 <= lVar47;
                    }
                  }
                }
              }
              psVar14[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar68 ^ 1);
              uVar67 = uVar67 + 1;
              plVar42 = plVar42 + 2;
            } while (count != uVar67);
            goto LAB_00b436f7;
          }
          if (count != 0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            plVar42 = (long *)(pdVar9 + 8);
            uVar67 = 0;
            local_4d0 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar8 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
              }
              if (!bVar69 && bVar68 == true) {
                lVar32 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
                lVar52 = (long)*piVar45 + lVar32 / 0x1e;
                lVar46 = (long)*(int *)((long)plVar42 + -4) + *plVar42 / 86400000000;
                lVar47 = (long)(int)plVar42[-1] + lVar46 / 0x1e;
                bVar68 = true;
                if (lVar52 <= lVar47) {
                  if (lVar52 < lVar47) {
                    bVar68 = false;
                  }
                  else {
                    lVar32 = lVar32 % 0x1e;
                    lVar46 = lVar46 % 0x1e;
                    if (lVar32 <= lVar46) {
                      bVar68 = *plVar42 % 86400000000 < *(long *)(piVar45 + 2) % 86400000000 &&
                               lVar46 <= lVar32;
                    }
                  }
                }
              }
              psVar14[local_4d0] = (sel_t)uVar33;
              local_4d0 = local_4d0 + bVar68;
              uVar67 = uVar67 + 1;
              plVar42 = plVar42 + 2;
            } while (count != uVar67);
            goto LAB_00b43709;
          }
        }
        else if (count != 0) {
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          plVar42 = (long *)(pdVar9 + 8);
          lVar46 = 0;
          local_4d0 = 0;
          uVar67 = 0;
          do {
            uVar33 = uVar67;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar67];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar8 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar8[uVar67 >> 6] >> (uVar67 & 0x3f) & 1) != 0;
            }
            if (!bVar69 && bVar68 == true) {
              lVar47 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
              lVar66 = (long)*piVar45 + lVar47 / 0x1e;
              lVar32 = (long)*(int *)((long)plVar42 + -4) + *plVar42 / 86400000000;
              lVar52 = (long)(int)plVar42[-1] + lVar32 / 0x1e;
              bVar68 = true;
              if (lVar66 <= lVar52) {
                if (lVar66 < lVar52) {
                  bVar68 = false;
                }
                else {
                  lVar47 = lVar47 % 0x1e;
                  lVar32 = lVar32 % 0x1e;
                  if (lVar47 <= lVar32) {
                    bVar68 = *plVar42 % 86400000000 < *(long *)(piVar45 + 2) % 86400000000 &&
                             lVar32 <= lVar47;
                  }
                }
              }
            }
            psVar14[local_4d0] = (sel_t)uVar33;
            local_4d0 = local_4d0 + bVar68;
            psVar10[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar68 ^ 1);
            uVar67 = uVar67 + 1;
            plVar42 = plVar42 + 2;
          } while (count != uVar67);
          goto LAB_00b43709;
        }
        goto LAB_00b3fc75;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar45 = (int *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        piVar55 = (int *)right->data;
        puVar43 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (ulong *)0x0) {
          if (puVar43 != (ulong *)0x0) {
            bVar69 = false;
            goto LAB_00b412a7;
          }
        }
        else {
          uVar67 = *puVar2;
          bVar69 = (uVar67 & 1) == 0;
          if (puVar43 == (ulong *)0x0) {
            if ((uVar67 & 1) == 0) goto LAB_00b41381;
          }
          else {
LAB_00b412a7:
            if ((*puVar43 & 1) == 0 || bVar69) {
              if ((*puVar43 & 1) != 0) goto LAB_00b41381;
              goto LAB_00b41cf9;
            }
          }
        }
        lVar46 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
        lVar52 = lVar46 % 0x1e;
        lVar47 = (long)*piVar45 + lVar46 / 0x1e;
        lVar32 = (long)piVar55[1] + *(long *)(piVar55 + 2) / 86400000000;
        lVar46 = lVar32 % 0x1e;
        lVar32 = (long)*piVar55 + lVar32 / 0x1e;
        if ((lVar32 < lVar47) ||
           ((lVar32 <= lVar47 &&
            ((lVar46 < lVar52 ||
             ((lVar46 <= lVar52 &&
              (*(long *)(piVar55 + 2) % 86400000000 < *(long *)(piVar45 + 2) % 86400000000)))))))) {
LAB_00b41381:
          if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            psVar14 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar13 != (sel_t *)0x0) {
                sVar44 = psVar13[iVar34];
              }
              psVar14[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
LAB_00b41cf9:
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          psVar14[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            local_4a0 = 0;
          }
          else {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar46 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            local_4a0 = 0;
            uVar67 = 0;
            do {
              uVar33 = uVar67;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar67];
              }
              uVar59 = uVar67;
              if (lVar46 != 0) {
                uVar59 = (ulong)*(uint *)(lVar46 + uVar67 * 4);
              }
              uVar58 = uVar67;
              if (psVar14 != (sel_t *)0x0) {
                uVar58 = (ulong)psVar14[uVar67];
              }
              lVar52 = uVar58 * 0x10;
              lVar32 = (long)*(int *)(LStack_490._0_8_ + uVar59 * 0x10 + 4) +
                       *(long *)(LStack_490._0_8_ + (uVar59 * 2 + 1) * 8) / 86400000000;
              lVar66 = lVar32 % 0x1e;
              lVar60 = (long)*(int *)(LStack_490._0_8_ + uVar59 * 0x10) + lVar32 / 0x1e;
              lVar47 = (long)*(int *)(LStack_420._0_8_ + lVar52 + 4) +
                       *(long *)(LStack_420._0_8_ + lVar52 + 8) / 86400000000;
              lVar32 = lVar47 % 0x1e;
              lVar47 = (long)*(int *)(LStack_420._0_8_ + lVar52) + lVar47 / 0x1e;
              if ((lVar60 <= lVar47) &&
                 ((lVar60 < lVar47 ||
                  ((lVar66 <= lVar32 &&
                   ((lVar66 < lVar32 ||
                    (*(long *)(LStack_490._0_8_ + (uVar59 * 2 + 1) * 8) % 86400000000 <=
                     *(long *)(LStack_420._0_8_ + lVar52 + 8) % 86400000000)))))))) {
                (false_sel.ptr)->sel_vector[local_4a0] = (sel_t)uVar33;
                local_4a0 = local_4a0 + 1;
              }
              uVar67 = uVar67 + 1;
            } while (count != uVar67);
          }
          local_4d0 = count - local_4a0;
        }
        else {
          if (count == 0) goto LAB_00b3b9a8;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4d0 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            lVar52 = iVar48 * 0x10;
            lVar32 = (long)*(int *)(LStack_490._0_8_ + iVar49 * 0x10 + 4) +
                     *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) / 86400000000;
            lVar66 = lVar32 % 0x1e;
            lVar60 = (long)*(int *)(LStack_490._0_8_ + iVar49 * 0x10) + lVar32 / 0x1e;
            lVar47 = (long)*(int *)(LStack_420._0_8_ + lVar52 + 4) +
                     *(long *)(LStack_420._0_8_ + lVar52 + 8) / 86400000000;
            lVar32 = lVar47 % 0x1e;
            lVar47 = (long)*(int *)(LStack_420._0_8_ + lVar52) + lVar47 / 0x1e;
            if ((lVar47 < lVar60) ||
               ((lVar47 <= lVar60 &&
                ((lVar32 < lVar66 ||
                 ((lVar32 <= lVar66 &&
                  (*(long *)(LStack_420._0_8_ + lVar52 + 8) % 86400000000 <
                   *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) % 86400000000)))))))) {
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
              local_4d0 = local_4d0 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
      }
      else {
        if (count == 0) goto LAB_00b3b9a8;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        local_3c0 = *(element_type **)local_498;
        psVar14 = *(sel_t **)local_428;
        local_3b0 = 0;
        local_4d0 = 0;
        iVar34 = 0;
        do {
          iVar56 = iVar34;
          if (psVar13 != (sel_t *)0x0) {
            iVar56 = (idx_t)psVar13[iVar34];
          }
          iVar49 = iVar34;
          if (local_3c0 != (element_type *)0x0) {
            iVar49 = (idx_t)*(uint *)((long)&local_3c0->_vptr_ExtraTypeInfo + iVar34 * 4);
          }
          iVar48 = iVar34;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar34];
          }
          lVar66 = iVar48 * 0x10;
          lVar46 = (long)*(int *)(LStack_490._0_8_ + iVar49 * 0x10 + 4) +
                   *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) / 86400000000;
          lVar47 = lVar46 % 0x1e;
          lVar52 = (long)*(int *)(LStack_490._0_8_ + iVar49 * 0x10) + lVar46 / 0x1e;
          lVar32 = (long)*(int *)(LStack_420._0_8_ + lVar66 + 4) +
                   *(long *)(LStack_420._0_8_ + lVar66 + 8) / 86400000000;
          lVar46 = lVar32 % 0x1e;
          lVar32 = (long)*(int *)(LStack_420._0_8_ + lVar66) + lVar32 / 0x1e;
          if ((lVar32 < lVar52) ||
             ((lVar32 <= lVar52 &&
              ((lVar46 < lVar47 ||
               ((lVar46 <= lVar47 &&
                (*(long *)(LStack_420._0_8_ + lVar66 + 8) % 86400000000 <
                 *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) % 86400000000)))))))) {
            iVar49 = local_4d0;
            oVar29.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar49 = local_3b0;
            oVar29.ptr = false_sel.ptr;
            local_3b0 = local_3b0 + 1;
          }
          (oVar29.ptr)->sel_vector[iVar49] = (sel_t)iVar56;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
    }
    else {
      local_3c0 = LStack_490.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            local_4d0 = 0;
          }
          else {
            psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar46 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            local_4d0 = 0;
            iVar34 = 0;
            do {
              iVar56 = iVar34;
              if (psVar13 != (sel_t *)0x0) {
                iVar56 = (idx_t)psVar13[iVar34];
              }
              iVar49 = iVar34;
              if (lVar46 != 0) {
                iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar48 = iVar34;
              if (psVar14 != (sel_t *)0x0) {
                iVar48 = (idx_t)psVar14[iVar34];
              }
              if (LStack_490.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                if (LStack_420.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  bVar69 = false;
                  goto LAB_00b40159;
                }
LAB_00b40180:
                piVar45 = (int *)(LStack_490._0_8_ + iVar49 * 0x10);
                piVar55 = (int *)(LStack_420._0_8_ + iVar48 * 0x10);
                lVar32 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
                lVar66 = lVar32 % 0x1e;
                lVar52 = (long)*piVar45 + lVar32 / 0x1e;
                lVar47 = (long)piVar55[1] + *(long *)(piVar55 + 2) / 86400000000;
                lVar32 = lVar47 % 0x1e;
                lVar47 = (long)*piVar55 + lVar47 / 0x1e;
                if ((lVar52 <= lVar47) &&
                   ((lVar52 < lVar47 ||
                    ((lVar66 <= lVar32 &&
                     ((lVar66 < lVar32 ||
                      (*(long *)(piVar45 + 2) % 86400000000 <= *(long *)(piVar55 + 2) % 86400000000)
                      ))))))) {
LAB_00b40279:
                  (false_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
                  local_4d0 = local_4d0 + 1;
                }
              }
              else {
                uVar67 = 1L << ((byte)iVar49 & 0x3f) &
                         *(ulong *)((long)LStack_490.type_info_.internal.
                                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + (iVar49 >> 6) * 8);
                bVar69 = uVar67 == 0;
                if (LStack_420.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
LAB_00b40159:
                  uVar67 = 1L << ((byte)iVar48 & 0x3f) &
                           (ulong)(&(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6];
                  if ((!bVar69) && (uVar67 != 0)) goto LAB_00b40180;
                  if (uVar67 != 0) goto LAB_00b4029f;
                  goto LAB_00b40279;
                }
                if (uVar67 != 0) goto LAB_00b40180;
              }
LAB_00b4029f:
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          local_4d0 = count - local_4d0;
        }
        else {
          if (count == 0) goto LAB_00b3b9a8;
          psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar46 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4d0 = 0;
          do {
            iVar56 = iVar34;
            if (psVar13 != (sel_t *)0x0) {
              iVar56 = (idx_t)psVar13[iVar34];
            }
            iVar49 = iVar34;
            if (lVar46 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar48 = iVar34;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar34];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                bVar69 = false;
                goto LAB_00b3a9d9;
              }
LAB_00b3a9ff:
              piVar55 = (int *)(LStack_490._0_8_ + iVar49 * 0x10);
              piVar45 = (int *)(LStack_420._0_8_ + iVar48 * 0x10);
              lVar32 = (long)piVar55[1] + *(long *)(piVar55 + 2) / 86400000000;
              lVar66 = lVar32 % 0x1e;
              lVar52 = (long)*piVar55 + lVar32 / 0x1e;
              lVar47 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
              lVar32 = lVar47 % 0x1e;
              lVar47 = (long)*piVar45 + lVar47 / 0x1e;
              if ((lVar47 < lVar52) ||
                 ((lVar47 <= lVar52 &&
                  ((lVar32 < lVar66 ||
                   ((lVar32 <= lVar66 &&
                    (*(long *)(piVar45 + 2) % 86400000000 < *(long *)(piVar55 + 2) % 86400000000))))
                  )))) {
LAB_00b3aaff:
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar56;
                local_4d0 = local_4d0 + 1;
              }
            }
            else {
              uVar67 = 1L << ((byte)iVar49 & 0x3f) &
                       *(ulong *)((long)LStack_490.type_info_.internal.
                                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + (iVar49 >> 6) * 8);
              bVar69 = uVar67 == 0;
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                if (uVar67 != 0) goto LAB_00b3a9ff;
                goto LAB_00b3aaff;
              }
LAB_00b3a9d9:
              uVar67 = 1L << ((byte)iVar48 & 0x3f) &
                       (ulong)(&(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6];
              if ((!bVar69) && (uVar67 != 0)) goto LAB_00b3a9ff;
              if (uVar67 != 0) goto LAB_00b3aaff;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
      }
      else {
        if (count == 0) goto LAB_00b3b9a8;
        psVar13 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar46 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_3b0 = 0;
        local_4d0 = 0;
        iVar34 = 0;
        do {
          iVar56 = iVar34;
          if (psVar13 != (sel_t *)0x0) {
            iVar56 = (idx_t)psVar13[iVar34];
          }
          iVar49 = iVar34;
          if (lVar46 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
          }
          iVar48 = iVar34;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar34];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              bVar69 = false;
              goto LAB_00b38580;
            }
LAB_00b385a7:
            piVar45 = (int *)(LStack_490._0_8_ + iVar49 * 0x10);
            piVar55 = (int *)(LStack_420._0_8_ + iVar48 * 0x10);
            lVar32 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
            lVar66 = lVar32 % 0x1e;
            lVar52 = (long)*piVar45 + lVar32 / 0x1e;
            lVar47 = (long)piVar55[1] + *(long *)(piVar55 + 2) / 86400000000;
            lVar32 = lVar47 % 0x1e;
            lVar47 = (long)*piVar55 + lVar47 / 0x1e;
            if ((lVar47 < lVar52) ||
               ((lVar47 <= lVar52 &&
                ((lVar32 < lVar66 ||
                 ((lVar32 <= lVar66 &&
                  (*(long *)(piVar55 + 2) % 86400000000 < *(long *)(piVar45 + 2) % 86400000000))))))
               )) goto LAB_00b386a9;
LAB_00b38686:
            iVar49 = local_3b0;
            oVar29.ptr = false_sel.ptr;
            local_3b0 = local_3b0 + 1;
          }
          else {
            uVar67 = 1L << ((byte)iVar49 & 0x3f) &
                     *(ulong *)((long)LStack_490.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + (iVar49 >> 6) * 8);
            bVar69 = uVar67 == 0;
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
LAB_00b38580:
              uVar67 = 1L << ((byte)iVar48 & 0x3f) &
                       (ulong)(&(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6];
              if ((!bVar69) && (uVar67 != 0)) goto LAB_00b385a7;
              if (uVar67 != 0) goto LAB_00b386a9;
              goto LAB_00b38686;
            }
            if (uVar67 != 0) goto LAB_00b385a7;
LAB_00b386a9:
            iVar49 = local_4d0;
            oVar29.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
          }
          (oVar29.ptr)->sel_vector[iVar49] = (sel_t)iVar56;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
    }
LAB_00b40fd9:
    if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
    }
    if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
    }
    if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
    }
LAB_00b43709:
    if ((element_type *)local_478._M_pi != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478._M_pi);
      return local_4d0;
    }
    return local_4d0;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_218.ptr = false_sel.ptr;
    local_210.ptr = true_sel.ptr;
    local_208.ptr = sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_208.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&local_118,count);
    OptionalSelection::OptionalSelection(&local_198,&local_118);
    SelectionVector::SelectionVector(&local_130,count);
    OptionalSelection::OptionalSelection(&local_1b8,&local_130);
    SelectionVector::SelectionVector(&local_378,count);
    Vector::Vector(&local_100,left);
    Vector::Vector(&local_98,right);
    optional_ptr<const_duckdb::SelectionVector,_true>::CheckValid(&local_208);
    oVar30.ptr = local_208.ptr;
    local_200.sel = (SelectionVector *)null_mask.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(&local_100,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(&local_98,count,(UnifiedVectorFormat *)local_428);
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (count == 0) {
        local_4a0 = 0;
        uVar67 = 0;
      }
      else {
        psVar13 = (oVar30.ptr)->sel_vector;
        local_4a0 = 0;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar13 != (sel_t *)0x0) {
            sVar44 = psVar13[iVar34];
          }
          *(sel_t *)((long)(sel_t **)local_378.sel_vector + iVar34 * 4) = sVar44;
          iVar34 = iVar34 + 1;
          uVar67 = count;
        } while (count != iVar34);
      }
    }
    else {
      SelectionVector::SelectionVector((SelectionVector *)&local_2f8,count);
      if (count == 0) {
        local_4a0 = 0;
        lVar46 = 0;
        uVar67 = 0;
      }
      else {
        local_4a0 = 0;
        uVar67 = 0;
        uVar33 = 0;
        lVar46 = 0;
        do {
          psVar13 = (oVar30.ptr)->sel_vector;
          uVar59 = uVar33;
          if (psVar13 != (sel_t *)0x0) {
            uVar59 = (ulong)psVar13[uVar33];
          }
          uVar58 = uVar33;
          if (*(long *)local_498 != 0) {
            uVar58 = (ulong)*(uint *)(*(long *)local_498 + uVar33 * 4);
          }
          uVar57 = uVar33;
          if (*(sel_t **)local_428 != (sel_t *)0x0) {
            uVar57 = (ulong)(*(sel_t **)local_428)[uVar33];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar58 >> 6) * 8) >> (uVar58 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar57 >> 6] >> (uVar57 & 0x3f) & 1)
                     != 0;
          }
          uVar35 = (undefined4)uVar59;
          if ((bool)(bVar69 | bVar68 ^ 1U)) {
            if (local_200.sel != (SelectionVector *)0x0) {
              optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                        ((optional_ptr<duckdb::ValidityMask,_true> *)&local_200);
              pSVar21 = local_200.sel;
              _Var22._M_head_impl =
                   ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                   validity_mask;
              if (_Var22._M_head_impl == (unsigned_long *)0x0) {
                local_178.sel = (SelectionVector *)local_200.sel[1].sel_vector;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_288,(unsigned_long *)&local_178);
                auVar19 = local_288;
                uVar17 = aLStack_280[0]._0_8_;
                _local_288 = (undefined1  [16])0x0;
                p_Var25 = (pSVar21->selection_data).internal.
                          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                (pSVar21->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)auVar19;
                (pSVar21->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17;
                if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_280[0]._0_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_280[0]._0_8_)
                    ;
                  }
                }
                pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)&pSVar21->selection_data);
                _Var22._M_head_impl =
                     (pTVar31->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                ((TemplatedValidityMask<unsigned_long> *)&pSVar21->sel_vector)->validity_mask =
                     _Var22._M_head_impl;
              }
              bVar15 = (byte)uVar59 & 0x3f;
              _Var22._M_head_impl[uVar59 >> 6] =
                   _Var22._M_head_impl[uVar59 >> 6] &
                   (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
            }
            if (bVar68) {
              if ((OptionalSelection *)local_198.sel != (OptionalSelection *)0x0) {
                *(undefined4 *)
                 ((long)&((SelectionVector *)(local_198.sel)->sel_vector)->sel_vector +
                 local_4a0 * 4) = uVar35;
              }
              local_4a0 = local_4a0 + 1;
            }
            else {
              if ((OptionalSelection *)local_1b8.sel != (OptionalSelection *)0x0) {
                *(undefined4 *)
                 ((long)&((SelectionVector *)(local_1b8.sel)->sel_vector)->sel_vector + lVar46 * 4)
                     = uVar35;
              }
              lVar46 = lVar46 + 1;
            }
          }
          else {
            *(sel_t *)(local_2f8._0_8_ + uVar67 * 4) = (sel_t)uVar33;
            *(undefined4 *)((long)(sel_t **)local_378.sel_vector + uVar67 * 4) = uVar35;
            uVar67 = uVar67 + 1;
          }
          uVar33 = uVar33 + 1;
        } while (count != uVar33);
      }
      pSVar21 = local_198.sel;
      if ((OptionalSelection *)local_198.sel != (OptionalSelection *)0x0) {
        pSVar3 = (SelectionVector *)(local_198.sel)->sel_vector;
        p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((SelectionVector *)&(local_198.sel)->selection_data)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ((local_198.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ((local_198.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
        }
        pSVar21->sel_vector = (sel_t *)((long)&pSVar3->sel_vector + local_4a0 * 4);
      }
      pSVar21 = local_1b8.sel;
      if ((OptionalSelection *)local_1b8.sel != (OptionalSelection *)0x0) {
        pSVar3 = (SelectionVector *)(local_1b8.sel)->sel_vector;
        p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((SelectionVector *)&(local_1b8.sel)->selection_data)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ((local_1b8.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ((local_1b8.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
        }
        pSVar21->sel_vector = (sel_t *)((long)&pSVar3->sel_vector + lVar46 * 4);
      }
      if (uVar67 < count && uVar67 != 0) {
        Vector::Slice(&local_100,(SelectionVector *)&local_2f8,uVar67);
        Vector::Slice(&local_98,(SelectionVector *)&local_2f8,uVar67);
      }
      if (local_2f8.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_2f8.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
    }
    if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
    }
    if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
    }
    if (local_478._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478._M_pi);
    }
    PVar1 = (left->type).physical_type_;
    if (PVar1 == LIST) {
      local_3b8 = (optional_ptr<duckdb::ValidityMask,_true>)
                  (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
      if (uVar67 == 0) goto LAB_00b35c60;
      SelectionVector::SelectionVector(&local_390,uVar67);
      SelectionVector::SelectionVector(&local_360,uVar67);
      pVVar23 = ListVector::GetEntry(&local_100);
      Vector::Vector((Vector *)local_498,pVVar23);
      pVVar23 = ListVector::GetEntry(&local_98);
      Vector::Vector((Vector *)local_428,pVVar23);
      iVar34 = ListVector::GetListSize(&local_100);
      Vector::Flatten((Vector *)local_498,iVar34);
      iVar34 = ListVector::GetListSize(&local_98);
      Vector::Flatten((Vector *)local_428,iVar34);
      Vector::Vector(&local_2f8,(Vector *)local_498,&local_390,uVar67);
      Vector::Vector((Vector *)local_288,(Vector *)local_428,&local_360,uVar67);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_178);
      Vector::ToUnifiedFormat(&local_100,uVar67,&local_178);
      pdVar11 = local_178.data;
      UnifiedVectorFormat::UnifiedVectorFormat(&local_200);
      Vector::ToUnifiedFormat(&local_98,uVar67,&local_200);
      pdVar9 = local_200.data;
      SelectionVector::SelectionVector(&local_3a8,uVar67);
      auVar16 = _DAT_012acff0;
      lVar46 = uVar67 - 1;
      auVar72._8_4_ = (int)lVar46;
      auVar72._0_8_ = lVar46;
      auVar72._12_4_ = (int)((ulong)lVar46 >> 0x20);
      uVar33 = 0;
      auVar72 = auVar72 ^ _DAT_012acff0;
      auVar74 = _DAT_012acfe0;
      do {
        auVar75 = auVar74 ^ auVar16;
        if ((bool)(~(auVar75._4_4_ == auVar72._4_4_ && auVar72._0_4_ < auVar75._0_4_ ||
                    auVar72._4_4_ < auVar75._4_4_) & 1)) {
          local_3a8.sel_vector[uVar33] = (sel_t)uVar33;
        }
        if ((auVar75._12_4_ != auVar72._12_4_ || auVar75._8_4_ <= auVar72._8_4_) &&
            auVar75._12_4_ <= auVar72._12_4_) {
          local_3a8.sel_vector[uVar33 + 1] = (sel_t)uVar33 + 1;
        }
        uVar33 = uVar33 + 2;
        lVar46 = auVar74._8_8_;
        auVar74._0_8_ = auVar74._0_8_ + 2;
        auVar74._8_8_ = lVar46 + 2;
      } while ((uVar67 + 1 & 0xfffffffffffffffe) != uVar33);
      SelectionVector::SelectionVector(&local_310,uVar67);
      SelectionVector::SelectionVector((SelectionVector *)(local_348 + 0x20),uVar67);
      local_348._0_16_ = (undefined1  [16])0x0;
      local_348._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_348._24_8_ = (element_type *)0x800;
      if (local_3b8.ptr == (ValidityMask *)0x0) {
        local_4a8.ptr = (ValidityMask *)0x0;
      }
      else {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3b8);
        peVar24 = (element_type *)ValidityMask::Capacity(local_3b8.ptr);
        uVar17 = local_348._16_8_;
        local_348._0_16_ = (undefined1  [16])0x0;
        local_348._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
        }
        local_4a8.ptr = (ValidityMask *)local_348;
        local_348._24_8_ = peVar24;
      }
      local_4d0 = 0;
      uVar33 = 0;
      do {
        pSVar21 = local_198.sel;
        psVar13 = (local_178.sel)->sel_vector;
        uVar59 = 0;
        do {
          uVar58 = uVar59;
          if (local_3a8.sel_vector != (sel_t *)0x0) {
            uVar58 = (ulong)local_3a8.sel_vector[uVar59];
          }
          if (psVar13 != (sel_t *)0x0) {
            uVar58 = (ulong)psVar13[uVar58];
          }
          iVar36 = (int)uVar33;
          local_390.sel_vector[uVar59] = *(int *)((long)local_178.data + uVar58 * 2 * 8) + iVar36;
          uVar59 = uVar59 + 1;
        } while (uVar67 != uVar59);
        puVar8 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                 validity_mask;
        uVar59 = 0;
        do {
          uVar58 = uVar59;
          if (local_3a8.sel_vector != (sel_t *)0x0) {
            uVar58 = (ulong)local_3a8.sel_vector[uVar59];
          }
          if (puVar8 != (unsigned_long *)0x0) {
            uVar58 = (ulong)*(uint *)((long)puVar8 + uVar58 * 4);
          }
          *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_360.sel_vector)->
                          validity_mask + uVar59 * 4) =
               *(int *)(local_200.data + uVar58 * 0x10) + iVar36;
          uVar59 = uVar59 + 1;
        } while (uVar67 != uVar59);
        uVar59 = 0;
        uVar58 = 0;
        local_4c0 = 0;
        lVar46 = 0;
        do {
          uVar57 = uVar59;
          if (local_3a8.sel_vector != (sel_t *)0x0) {
            uVar57 = (ulong)local_3a8.sel_vector[uVar59];
          }
          uVar50 = uVar57;
          if (psVar13 != (sel_t *)0x0) {
            uVar50 = (ulong)psVar13[uVar57];
          }
          uVar51 = uVar57;
          if (puVar8 != (unsigned_long *)0x0) {
            uVar51 = (ulong)*(uint *)((long)puVar8 + uVar57 * 4);
          }
          if ((*(ulong *)((long)pdVar11 + (uVar50 * 2 + 1) * 8) == uVar33) ||
             (*(ulong *)(pdVar9 + uVar51 * 0x10 + 8) == uVar33)) {
            if ((SelectionVector *)local_378.sel_vector != (SelectionVector *)0x0) {
              uVar57 = (ulong)*(uint *)((long)(sel_t **)local_378.sel_vector + uVar57 * 4);
            }
            if (*(ulong *)(pdVar9 + uVar51 * 0x10 + 8) <
                *(ulong *)((long)pdVar11 + (uVar50 * 2 + 1) * 8)) {
              if ((OptionalSelection *)local_198.sel != (OptionalSelection *)0x0) {
                *(int *)((long)&((SelectionVector *)(local_198.sel)->sel_vector)->sel_vector +
                        local_4c0 * 4) = (int)uVar57;
              }
              local_4c0 = local_4c0 + 1;
            }
            else {
              if ((OptionalSelection *)local_1b8.sel != (OptionalSelection *)0x0) {
                *(int *)((long)&((SelectionVector *)(local_1b8.sel)->sel_vector)->sel_vector +
                        lVar46 * 4) = (int)uVar57;
              }
              lVar46 = lVar46 + 1;
            }
          }
          else {
            *(sel_t *)((long)&(((AllocatedData *)local_310.sel_vector)->allocator).ptr + uVar58 * 4)
                 = (sel_t)uVar57;
            uVar58 = uVar58 + 1;
          }
          uVar59 = uVar59 + 1;
        } while (uVar67 != uVar59);
        if ((OptionalSelection *)local_198.sel != (OptionalSelection *)0x0) {
          pSVar3 = (SelectionVector *)(local_198.sel)->sel_vector;
          p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((SelectionVector *)&(local_198.sel)->selection_data)->selection_data).internal
                    .super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ((local_198.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          ((local_198.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          pSVar21->sel_vector = (sel_t *)((long)&pSVar3->sel_vector + local_4c0 * 4);
        }
        pSVar21 = local_1b8.sel;
        if ((OptionalSelection *)local_1b8.sel != (OptionalSelection *)0x0) {
          pSVar3 = (SelectionVector *)(local_1b8.sel)->sel_vector;
          p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((SelectionVector *)&(local_1b8.sel)->selection_data)->selection_data).internal
                    .super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ((local_1b8.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          ((local_1b8.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          pSVar21->sel_vector = (sel_t *)((long)&pSVar3->sel_vector + lVar46 * 4);
        }
        if (uVar58 < uVar67) {
          if (uVar58 == 0) {
            uVar67 = 0;
          }
          else {
            uVar67 = 0;
            do {
              sVar44 = (sel_t)uVar67;
              if ((element_type *)local_310.sel_vector != (element_type *)0x0) {
                sVar44 = *(sel_t *)((long)&(((AllocatedData *)local_310.sel_vector)->allocator).ptr
                                   + uVar67 * 4);
              }
              local_3a8.sel_vector[uVar67] = sVar44;
              uVar67 = uVar67 + 1;
            } while (uVar58 != uVar67);
            psVar13 = (local_178.sel)->sel_vector;
            uVar67 = 0;
            do {
              uVar59 = uVar67;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar59 = (ulong)local_3a8.sel_vector[uVar67];
              }
              if (psVar13 != (sel_t *)0x0) {
                uVar59 = (ulong)psVar13[uVar59];
              }
              local_390.sel_vector[uVar67] =
                   *(int *)((long)local_178.data + uVar59 * 2 * 8) + iVar36;
              uVar67 = uVar67 + 1;
            } while (uVar58 != uVar67);
            puVar8 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                     validity_mask;
            uVar59 = 0;
            do {
              uVar67 = uVar59;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar67 = (ulong)local_3a8.sel_vector[uVar59];
              }
              if (puVar8 != (unsigned_long *)0x0) {
                uVar67 = (ulong)*(uint *)((long)puVar8 + uVar67 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_360.sel_vector)->
                              validity_mask + uVar59 * 4) =
                   *(int *)(local_200.data + uVar67 * 0x10) + iVar36;
              uVar59 = uVar59 + 1;
              uVar67 = uVar58;
            } while (uVar58 != uVar59);
          }
        }
        iVar34 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                           (&local_2f8,(Vector *)local_288,&local_3a8,uVar67,&local_310,
                            (SelectionVector *)(local_348 + 0x20),local_4a8);
        ExtractNestedMask(&local_3a8,uVar67,&local_378,local_4a8.ptr,local_3b8);
        local_4d0 = local_4c0 + local_4d0;
        if (iVar34 != 0) {
          oVar29.ptr = &local_310;
          if (uVar67 == iVar34) {
            oVar29.ptr = &local_3a8;
          }
          ExtractNestedSelection
                    ((SelectionVector *)(oVar29.ptr)->sel_vector,iVar34,
                     (SelectionVector *)local_378.sel_vector,(OptionalSelection *)local_198.sel);
          local_4d0 = local_4d0 + iVar34;
          uVar67 = uVar67 - iVar34;
          if (uVar67 == 0) {
            uVar67 = 0;
          }
          else {
            uVar59 = 0;
            do {
              sVar44 = (sel_t)uVar59;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._32_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                sVar44 = *(sel_t *)((long)(_func_int ***)local_348._32_8_ + uVar59 * 4);
              }
              local_3a8.sel_vector[uVar59] = sVar44;
              uVar59 = uVar59 + 1;
            } while (uVar67 != uVar59);
            psVar13 = (local_178.sel)->sel_vector;
            uVar59 = 0;
            do {
              uVar58 = uVar59;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar58 = (ulong)local_3a8.sel_vector[uVar59];
              }
              if (psVar13 != (sel_t *)0x0) {
                uVar58 = (ulong)psVar13[uVar58];
              }
              local_390.sel_vector[uVar59] =
                   *(int *)((long)local_178.data + uVar58 * 2 * 8) + iVar36;
              uVar59 = uVar59 + 1;
            } while (uVar67 != uVar59);
            puVar8 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                     validity_mask;
            uVar59 = 0;
            do {
              uVar58 = uVar59;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar58 = (ulong)local_3a8.sel_vector[uVar59];
              }
              if (puVar8 != (unsigned_long *)0x0) {
                uVar58 = (ulong)*(uint *)((long)puVar8 + uVar58 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_360.sel_vector)->
                              validity_mask + uVar59 * 4) =
                   *(int *)(local_200.data + uVar58 * 0x10) + iVar36;
              uVar59 = uVar59 + 1;
            } while (uVar67 != uVar59);
          }
        }
        iVar34 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                           (&local_2f8,(Vector *)local_288,&local_3a8,uVar67,
                            (SelectionVector *)(local_348 + 0x20),&local_310,local_4a8);
        ExtractNestedMask(&local_3a8,uVar67,&local_378,local_4a8.ptr,local_3b8);
        uVar67 = uVar67 - iVar34;
        oVar30.ptr = (SelectionVector *)(local_348 + 0x20);
        if (uVar67 == 0) {
          oVar30.ptr = &local_3a8;
        }
        ExtractNestedSelection
                  ((SelectionVector *)(oVar30.ptr)->sel_vector,iVar34,
                   (SelectionVector *)local_378.sel_vector,(OptionalSelection *)local_1b8.sel);
        if (iVar34 != 0) {
          if (uVar67 == 0) break;
          uVar59 = 0;
          do {
            sVar44 = (sel_t)uVar59;
            if ((element_type *)local_310.sel_vector != (element_type *)0x0) {
              sVar44 = *(sel_t *)((long)&(((AllocatedData *)local_310.sel_vector)->allocator).ptr +
                                 uVar59 * 4);
            }
            local_3a8.sel_vector[uVar59] = sVar44;
            uVar59 = uVar59 + 1;
          } while (uVar67 != uVar59);
        }
        uVar33 = uVar33 + 1;
      } while (uVar67 != 0);
LAB_00b3a089:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_);
      }
      if (local_318 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_318);
      }
      if (local_310.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_310.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_3a8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3a8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_200.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_200.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_178.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_178.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
      }
      if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_pi);
      }
      if (local_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_288 + 8));
      if (local_2f8.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2f8.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_2f8.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2f8.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_2f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_2f8 + 8));
      if (local_3c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8._M_pi);
      }
      if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
      }
      if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_428 + 8));
      if (local_438._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_438._M_pi);
      }
      if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
      }
      if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_498 + 8));
      if (local_360.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_360.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_390.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_390.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    else {
      if (PVar1 == STRUCT) {
        local_360.sel_vector = (sel_t *)null_mask.ptr;
        if (uVar67 != 0) {
          _local_288 = (undefined1  [16])0x0;
          aLStack_280[0].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_178.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          local_178.sel = (SelectionVector *)0x0;
          local_178.data = (data_ptr_t)0x0;
          this = StructVector::GetEntries(&local_100);
          this_00 = StructVector::GetEntries(&local_98);
          SelectionVector::SelectionVector((SelectionVector *)&local_200,uVar67);
          auVar16 = _DAT_012acff0;
          lVar46 = uVar67 - 1;
          auVar71._8_4_ = (int)lVar46;
          auVar71._0_8_ = lVar46;
          auVar71._12_4_ = (int)((ulong)lVar46 >> 0x20);
          uVar33 = 0;
          auVar71 = auVar71 ^ _DAT_012acff0;
          auVar75 = _DAT_012acfe0;
          do {
            auVar74 = auVar75 ^ auVar16;
            if ((bool)(~(auVar74._4_4_ == auVar71._4_4_ && auVar71._0_4_ < auVar74._0_4_ ||
                        auVar71._4_4_ < auVar74._4_4_) & 1)) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)
                              ->validity_mask + uVar33 * 4) = (int)uVar33;
            }
            if ((auVar74._12_4_ != auVar71._12_4_ || auVar74._8_4_ <= auVar71._8_4_) &&
                auVar74._12_4_ <= auVar71._12_4_) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)
                              ->validity_mask + uVar33 * 4 + 4) = (int)uVar33 + 1;
            }
            uVar33 = uVar33 + 2;
            lVar46 = auVar75._8_8_;
            auVar75._0_8_ = auVar75._0_8_ + 2;
            auVar75._8_8_ = lVar46 + 2;
          } while ((uVar67 + 1 & 0xfffffffffffffffe) != uVar33);
          SelectionVector::SelectionVector((SelectionVector *)local_348,uVar67);
          SelectionVector::SelectionVector(&local_390,uVar67);
          local_2f8.vector_type = FLAT_VECTOR;
          local_2f8._1_7_ = 0;
          local_2f8.type.id_ = INVALID;
          local_2f8.type.physical_type_ = ~INVALID;
          local_2f8.type._2_6_ = 0;
          local_2f8.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_2f8.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((ValidityMask *)local_360.sel_vector == (ValidityMask *)0x0) {
            null_mask_00.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                      ((optional_ptr<duckdb::ValidityMask,_true> *)&local_360);
            p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ValidityMask::Capacity((ValidityMask *)local_360.sel_vector);
            peVar18 = local_2f8.type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_2f8.vector_type = FLAT_VECTOR;
            local_2f8._1_7_ = 0;
            local_2f8.type.id_ = INVALID;
            local_2f8.type.physical_type_ = ~INVALID;
            local_2f8.type._2_6_ = 0;
            local_2f8.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            }
            null_mask_00.ptr = (ValidityMask *)&local_2f8;
            local_2f8.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = p_Var25;
          }
          if ((this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_4d0 = 0;
          }
          else {
            __n = 0;
            local_4d0 = 0;
            iVar34 = uVar67;
            do {
              pvVar26 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this,__n);
              pVVar27 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar26);
              Vector::Vector((Vector *)local_498,pVVar27);
              Vector::Flatten((Vector *)local_498,uVar67);
              Vector::Slice((Vector *)local_498,(SelectionVector *)&local_200,iVar34);
              pvVar26 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this_00,__n);
              pVVar27 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar26);
              Vector::Vector((Vector *)local_428,pVVar27);
              Vector::Flatten((Vector *)local_428,uVar67);
              Vector::Slice((Vector *)local_428,(SelectionVector *)&local_200,iVar34);
              iVar56 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                                 ((Vector *)local_498,(Vector *)local_428,
                                  (SelectionVector *)&local_200,iVar34,(SelectionVector *)local_348,
                                  &local_390,null_mask_00);
              ExtractNestedMask((SelectionVector *)&local_200,iVar34,&local_378,null_mask_00.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)local_360.sel_vector);
              if (iVar56 != 0) {
                pUVar28 = (UnifiedVectorFormat *)local_348;
                if (iVar34 == iVar56) {
                  pUVar28 = &local_200;
                }
                ExtractNestedSelection
                          (pUVar28->sel,iVar56,(SelectionVector *)local_378.sel_vector,
                           (OptionalSelection *)local_198.sel);
                iVar34 = iVar34 - iVar56;
                if (iVar34 != 0) {
                  iVar49 = 0;
                  do {
                    sVar44 = (sel_t)iVar49;
                    if (local_390.sel_vector != (sel_t *)0x0) {
                      sVar44 = local_390.sel_vector[iVar49];
                    }
                    *(sel_t *)((long)&((TemplatedValidityMask<unsigned_long> *)
                                      &(local_200.sel)->sel_vector)->validity_mask + iVar49 * 4) =
                         sVar44;
                    iVar49 = iVar49 + 1;
                  } while (iVar34 != iVar49);
                }
                local_4d0 = local_4d0 + iVar56;
              }
              if (__n == ((long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
                iVar56 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                                   ((Vector *)local_498,(Vector *)local_428,
                                    (SelectionVector *)&local_200,iVar34,
                                    (SelectionVector *)local_348,&local_390,null_mask_00);
                ExtractNestedMask((SelectionVector *)&local_200,iVar34,&local_378,null_mask_00.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_360.sel_vector);
                oVar30.ptr = (SelectionVector *)local_348;
                if (iVar34 - iVar56 == 0) {
                  oVar30.ptr = (SelectionVector *)&local_200;
                }
                ExtractNestedSelection
                          ((SelectionVector *)(oVar30.ptr)->sel_vector,iVar56,
                           (SelectionVector *)local_378.sel_vector,
                           (OptionalSelection *)local_198.sel);
                oVar30.ptr = &local_390;
                if (iVar56 == 0) {
                  oVar30.ptr = (SelectionVector *)&local_200;
                }
                ExtractNestedSelection
                          ((SelectionVector *)(oVar30.ptr)->sel_vector,iVar34 - iVar56,
                           (SelectionVector *)local_378.sel_vector,
                           (OptionalSelection *)local_1b8.sel);
                local_4d0 = local_4d0 + iVar56;
              }
              else {
                iVar56 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                   ((Vector *)local_498,(Vector *)local_428,
                                    (SelectionVector *)&local_200,iVar34,&local_390,
                                    (SelectionVector *)local_348,null_mask_00);
                ExtractNestedMask((SelectionVector *)&local_200,iVar34,&local_378,null_mask_00.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_360.sel_vector);
                iVar34 = iVar34 - iVar56;
                oVar30.ptr = &local_390;
                if (iVar34 == 0) {
                  oVar30.ptr = (SelectionVector *)&local_200;
                }
                ExtractNestedSelection
                          ((SelectionVector *)(oVar30.ptr)->sel_vector,iVar56,
                           (SelectionVector *)local_378.sel_vector,
                           (OptionalSelection *)local_1b8.sel);
                if (iVar56 != 0) {
                  if (iVar34 == 0) {
                    iVar34 = 0;
                  }
                  else {
                    iVar56 = 0;
                    do {
                      uVar35 = (undefined4)iVar56;
                      if ((SelectionVector *)local_348._0_8_ != (SelectionVector *)0x0) {
                        uVar35 = *(undefined4 *)((long)(sel_t **)local_348._0_8_ + iVar56 * 4);
                      }
                      *(undefined4 *)
                       ((long)&((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector
                               )->validity_mask + iVar56 * 4) = uVar35;
                      iVar56 = iVar56 + 1;
                    } while (iVar34 != iVar56);
                  }
                }
              }
              if (local_3c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8._M_pi);
              }
              if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
              }
              if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_428 + 8));
              if (local_438._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_438._M_pi);
              }
              if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
              }
              if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_498 + 8));
              __n = __n + 1;
            } while (__n < (ulong)((long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if (local_2f8.type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_2f8.type.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          if (local_390.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_390.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask);
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&local_178);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)local_288);
          goto LAB_00b3a24b;
        }
      }
      else {
        if (PVar1 != ARRAY) {
          this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_498 = (undefined1  [8])&LStack_490.type_info_;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_498,"Unimplemented type for DISTINCT","");
          NotImplementedException::NotImplementedException(this_01,(string *)local_498);
          __cxa_throw(this_01,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_3b8 = (optional_ptr<duckdb::ValidityMask,_true>)
                    (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
        if (uVar67 != 0) {
          iVar34 = ArrayType::GetSize(&local_100.type);
          SelectionVector::SelectionVector(&local_390,uVar67);
          SelectionVector::SelectionVector(&local_360,uVar67);
          pVVar23 = ArrayVector::GetEntry(&local_100);
          Vector::Vector((Vector *)local_498,pVVar23);
          pVVar23 = ArrayVector::GetEntry(&local_98);
          Vector::Vector((Vector *)local_428,pVVar23);
          iVar56 = ArrayVector::GetTotalSize(&local_100);
          Vector::Flatten((Vector *)local_498,iVar56);
          iVar56 = ArrayVector::GetTotalSize(&local_98);
          Vector::Flatten((Vector *)local_428,iVar56);
          Vector::Vector(&local_2f8,(Vector *)local_498,&local_390,uVar67);
          Vector::Vector((Vector *)local_288,(Vector *)local_428,&local_360,uVar67);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_178);
          Vector::ToUnifiedFormat(&local_100,uVar67,&local_178);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_200);
          Vector::ToUnifiedFormat(&local_98,uVar67,&local_200);
          SelectionVector::SelectionVector(&local_3a8,uVar67);
          auVar16 = _DAT_012acff0;
          lVar46 = uVar67 - 1;
          auVar70._8_4_ = (int)lVar46;
          auVar70._0_8_ = lVar46;
          auVar70._12_4_ = (int)((ulong)lVar46 >> 0x20);
          uVar33 = 0;
          auVar70 = auVar70 ^ _DAT_012acff0;
          auVar73 = _DAT_012acfe0;
          do {
            auVar74 = auVar73 ^ auVar16;
            if ((bool)(~(auVar74._4_4_ == auVar70._4_4_ && auVar70._0_4_ < auVar74._0_4_ ||
                        auVar70._4_4_ < auVar74._4_4_) & 1)) {
              local_3a8.sel_vector[uVar33] = (sel_t)uVar33;
            }
            if ((auVar74._12_4_ != auVar70._12_4_ || auVar74._8_4_ <= auVar70._8_4_) &&
                auVar74._12_4_ <= auVar70._12_4_) {
              local_3a8.sel_vector[uVar33 + 1] = (sel_t)uVar33 + 1;
            }
            uVar33 = uVar33 + 2;
            lVar46 = auVar73._8_8_;
            auVar73._0_8_ = auVar73._0_8_ + 2;
            auVar73._8_8_ = lVar46 + 2;
          } while ((uVar67 + 1 & 0xfffffffffffffffe) != uVar33);
          SelectionVector::SelectionVector(&local_310,uVar67);
          SelectionVector::SelectionVector((SelectionVector *)(local_348 + 0x20),uVar67);
          local_348._0_16_ = (undefined1  [16])0x0;
          local_348._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_348._24_8_ = (element_type *)0x800;
          if (local_3b8.ptr == (ValidityMask *)0x0) {
            local_4c8.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3b8);
            peVar24 = (element_type *)ValidityMask::Capacity(local_3b8.ptr);
            uVar17 = local_348._16_8_;
            local_348._0_16_ = (undefined1  [16])0x0;
            local_348._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
            }
            local_4c8.ptr = (ValidityMask *)local_348;
            local_348._24_8_ = peVar24;
          }
          iVar56 = 0;
          local_4d0 = 0;
          do {
            pSVar21 = local_198.sel;
            psVar13 = (local_178.sel)->sel_vector;
            uVar33 = 0;
            do {
              uVar59 = uVar33;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar59 = (ulong)local_3a8.sel_vector[uVar33];
              }
              if (psVar13 != (sel_t *)0x0) {
                uVar59 = (ulong)psVar13[uVar59];
              }
              iVar53 = (int)iVar34;
              iVar36 = (int)iVar56;
              local_390.sel_vector[uVar33] = (int)uVar59 * iVar53 + iVar36;
              uVar33 = uVar33 + 1;
            } while (uVar67 != uVar33);
            puVar8 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                     validity_mask;
            uVar33 = 0;
            do {
              uVar59 = uVar33;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar59 = (ulong)local_3a8.sel_vector[uVar33];
              }
              if (puVar8 != (unsigned_long *)0x0) {
                uVar59 = (ulong)*(uint *)((long)puVar8 + uVar59 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_360.sel_vector)->
                              validity_mask + uVar33 * 4) = (int)uVar59 * iVar53 + iVar36;
              uVar33 = uVar33 + 1;
            } while (uVar67 != uVar33);
            uVar33 = 0;
            uVar59 = 0;
            lVar46 = 0;
            do {
              uVar58 = uVar33;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar58 = (ulong)local_3a8.sel_vector[uVar33];
              }
              if (iVar34 == iVar56) {
                if ((SelectionVector *)local_378.sel_vector != (SelectionVector *)0x0) {
                  uVar58 = (ulong)*(uint *)((long)(sel_t **)local_378.sel_vector + uVar58 * 4);
                }
                if ((OptionalSelection *)local_1b8.sel != (OptionalSelection *)0x0) {
                  *(int *)((long)&((SelectionVector *)(local_1b8.sel)->sel_vector)->sel_vector +
                          lVar46 * 4) = (int)uVar58;
                }
                lVar46 = lVar46 + 1;
              }
              else {
                *(sel_t *)((long)&(((AllocatedData *)local_310.sel_vector)->allocator).ptr +
                          uVar59 * 4) = (sel_t)uVar58;
                uVar59 = uVar59 + 1;
              }
              uVar33 = uVar33 + 1;
            } while (uVar67 != uVar33);
            if ((OptionalSelection *)local_198.sel != (OptionalSelection *)0x0) {
              pSVar3 = (SelectionVector *)(local_198.sel)->sel_vector;
              p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (((SelectionVector *)&(local_198.sel)->selection_data)->selection_data).
                        internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              ((local_198.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              ((local_198.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
              }
              pSVar21->sel_vector = (sel_t *)pSVar3;
            }
            pSVar21 = local_1b8.sel;
            if ((OptionalSelection *)local_1b8.sel != (OptionalSelection *)0x0) {
              pSVar3 = (SelectionVector *)(local_1b8.sel)->sel_vector;
              p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (((SelectionVector *)&(local_1b8.sel)->selection_data)->selection_data).
                        internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              ((local_1b8.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              ((local_1b8.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
              }
              pSVar21->sel_vector = (sel_t *)((long)&pSVar3->sel_vector + lVar46 * 4);
            }
            if (uVar59 < uVar67) {
              if (uVar59 == 0) {
                uVar67 = 0;
              }
              else {
                uVar67 = 0;
                do {
                  sVar44 = (sel_t)uVar67;
                  if ((element_type *)local_310.sel_vector != (element_type *)0x0) {
                    sVar44 = *(sel_t *)((long)&(((AllocatedData *)local_310.sel_vector)->allocator).
                                               ptr + uVar67 * 4);
                  }
                  local_3a8.sel_vector[uVar67] = sVar44;
                  uVar67 = uVar67 + 1;
                } while (uVar59 != uVar67);
                psVar13 = (local_178.sel)->sel_vector;
                uVar67 = 0;
                do {
                  uVar33 = uVar67;
                  if (local_3a8.sel_vector != (sel_t *)0x0) {
                    uVar33 = (ulong)local_3a8.sel_vector[uVar67];
                  }
                  if (psVar13 != (sel_t *)0x0) {
                    uVar33 = (ulong)psVar13[uVar33];
                  }
                  local_390.sel_vector[uVar67] = (int)uVar33 * iVar53 + iVar36;
                  uVar67 = uVar67 + 1;
                } while (uVar59 != uVar67);
                puVar8 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                         validity_mask;
                uVar33 = 0;
                do {
                  uVar67 = uVar33;
                  if (local_3a8.sel_vector != (sel_t *)0x0) {
                    uVar67 = (ulong)local_3a8.sel_vector[uVar33];
                  }
                  if (puVar8 != (unsigned_long *)0x0) {
                    uVar67 = (ulong)*(uint *)((long)puVar8 + uVar67 * 4);
                  }
                  *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_360.sel_vector)->
                                  validity_mask + uVar33 * 4) = (int)uVar67 * iVar53 + iVar36;
                  uVar33 = uVar33 + 1;
                  uVar67 = uVar59;
                } while (uVar59 != uVar33);
              }
            }
            iVar49 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                               (&local_2f8,(Vector *)local_288,&local_3a8,uVar67,&local_310,
                                (SelectionVector *)(local_348 + 0x20),local_4c8);
            ExtractNestedMask(&local_3a8,uVar67,&local_378,local_4c8.ptr,local_3b8);
            if (iVar49 != 0) {
              oVar29.ptr = &local_310;
              if (uVar67 == iVar49) {
                oVar29.ptr = &local_3a8;
              }
              ExtractNestedSelection
                        ((SelectionVector *)(oVar29.ptr)->sel_vector,iVar49,
                         (SelectionVector *)local_378.sel_vector,(OptionalSelection *)local_198.sel)
              ;
              local_4d0 = local_4d0 + iVar49;
              uVar67 = uVar67 - iVar49;
              if (uVar67 == 0) {
                uVar67 = 0;
              }
              else {
                uVar33 = 0;
                do {
                  sVar44 = (sel_t)uVar33;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._32_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    sVar44 = *(sel_t *)((long)(_func_int ***)local_348._32_8_ + uVar33 * 4);
                  }
                  local_3a8.sel_vector[uVar33] = sVar44;
                  uVar33 = uVar33 + 1;
                } while (uVar67 != uVar33);
                psVar13 = (local_178.sel)->sel_vector;
                uVar33 = 0;
                do {
                  uVar59 = uVar33;
                  if (local_3a8.sel_vector != (sel_t *)0x0) {
                    uVar59 = (ulong)local_3a8.sel_vector[uVar33];
                  }
                  if (psVar13 != (sel_t *)0x0) {
                    uVar59 = (ulong)psVar13[uVar59];
                  }
                  local_390.sel_vector[uVar33] = (int)uVar59 * iVar53 + iVar36;
                  uVar33 = uVar33 + 1;
                } while (uVar67 != uVar33);
                puVar8 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                         validity_mask;
                uVar33 = 0;
                do {
                  uVar59 = uVar33;
                  if (local_3a8.sel_vector != (sel_t *)0x0) {
                    uVar59 = (ulong)local_3a8.sel_vector[uVar33];
                  }
                  if (puVar8 != (unsigned_long *)0x0) {
                    uVar59 = (ulong)*(uint *)((long)puVar8 + uVar59 * 4);
                  }
                  *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_360.sel_vector)->
                                  validity_mask + uVar33 * 4) = (int)uVar59 * iVar53 + iVar36;
                  uVar33 = uVar33 + 1;
                } while (uVar67 != uVar33);
              }
            }
            iVar49 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                               (&local_2f8,(Vector *)local_288,&local_3a8,uVar67,
                                (SelectionVector *)(local_348 + 0x20),&local_310,local_3b8);
            ExtractNestedMask(&local_3a8,uVar67,&local_378,local_4c8.ptr,local_3b8);
            uVar67 = uVar67 - iVar49;
            oVar30.ptr = (SelectionVector *)(local_348 + 0x20);
            if (uVar67 == 0) {
              oVar30.ptr = &local_3a8;
            }
            ExtractNestedSelection
                      ((SelectionVector *)(oVar30.ptr)->sel_vector,iVar49,
                       (SelectionVector *)local_378.sel_vector,(OptionalSelection *)local_1b8.sel);
            if (iVar49 != 0) {
              if (uVar67 == 0) break;
              uVar33 = 0;
              do {
                uVar59 = uVar33;
                if ((element_type *)local_310.sel_vector != (element_type *)0x0) {
                  uVar59 = (ulong)*(uint *)((long)&(((AllocatedData *)local_310.sel_vector)->
                                                   allocator).ptr + uVar33 * 4);
                }
                local_3a8.sel_vector[uVar33] = (sel_t)uVar59;
                uVar33 = uVar33 + 1;
              } while (uVar67 != uVar33);
            }
            iVar56 = iVar56 + 1;
          } while (uVar67 != 0);
          goto LAB_00b3a089;
        }
      }
LAB_00b35c60:
      local_4d0 = 0;
    }
LAB_00b3a24b:
    local_4d0 = local_4d0 + local_4a0;
    if ((local_210.ptr != (SelectionVector *)0x0) &&
       (optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_210), local_4d0 != 0)) {
      psVar13 = (local_210.ptr)->sel_vector;
      iVar34 = 0;
      do {
        sVar44 = (sel_t)iVar34;
        if (local_118.sel_vector != (sel_t *)0x0) {
          sVar44 = local_118.sel_vector[iVar34];
        }
        psVar13[iVar34] = sVar44;
        iVar34 = iVar34 + 1;
      } while (local_4d0 != iVar34);
    }
    if (local_218.ptr != (SelectionVector *)0x0) {
      optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_218);
      if (count != local_4d0) {
        psVar13 = (local_218.ptr)->sel_vector;
        lVar46 = 0;
        do {
          sVar44 = (sel_t)lVar46;
          if (local_130.sel_vector != (sel_t *)0x0) {
            sVar44 = local_130.sel_vector[lVar46];
          }
          psVar13[lVar46] = sVar44;
          lVar46 = lVar46 + 1;
        } while (count - local_4d0 != lVar46);
      }
    }
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_98.type);
    if (local_100.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_100.type);
    if (local_378.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_378.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_1b8.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_130.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_198.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_198.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    goto LAB_00b4369b;
  }
LAB_00b411b1:
  if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  local_118.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_478._M_pi;
  if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
    local_118.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_478._M_pi;
  }
LAB_00b4369b:
  if ((element_type *)
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return local_4d0;
}

Assistant:

static idx_t TemplatedDistinctSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel,
                                              idx_t count, optional_ptr<SelectionVector> true_sel,
                                              optional_ptr<SelectionVector> false_sel,
                                              optional_ptr<ValidityMask> null_mask) {

	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return DistinctSelect<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INT16:
		return DistinctSelect<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT32:
		return DistinctSelect<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT64:
		return DistinctSelect<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT8:
		return DistinctSelect<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT16:
		return DistinctSelect<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT32:
		return DistinctSelect<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT64:
		return DistinctSelect<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::INT128:
		return DistinctSelect<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                                null_mask);
	case PhysicalType::UINT128:
		return DistinctSelect<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::FLOAT:
		return DistinctSelect<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                        null_mask);
	case PhysicalType::DOUBLE:
		return DistinctSelect<double, double, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INTERVAL:
		return DistinctSelect<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::VARCHAR:
		return DistinctSelect<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return DistinctSelectNested<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for distinct selection");
	}
}